

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.cpp
# Opt level: O3

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int bpc)

{
  anon_struct_96_18_0d0905d3 *paVar1;
  byte bVar2;
  uchar uVar3;
  short sVar4;
  stbi_uc asVar5 [4];
  stbi_uc asVar6 [4];
  undefined8 uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  byte bVar29;
  short sVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined4 uVar37;
  undefined4 z;
  undefined4 z_00;
  stbi_uc sVar38;
  byte bVar39;
  int iVar40;
  stbi__uint32 sVar41;
  int iVar42;
  uint uVar43;
  stbi__jpeg *psVar44;
  char *pcVar45;
  byte *pbVar46;
  ulong uVar47;
  uchar *data_00;
  float *data_01;
  void *pvVar48;
  code *pcVar49;
  stbi__context *psVar50;
  stbi_uc *psVar51;
  uchar *puVar52;
  int iVar53;
  stbi_uc *psVar54;
  long lVar55;
  long lVar56;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  int extraout_EDX_07;
  uint uVar57;
  anon_struct_96_18_0d0905d3 *extraout_RDX;
  anon_struct_96_18_0d0905d3 *extraout_RDX_00;
  anon_struct_96_18_0d0905d3 *extraout_RDX_01;
  anon_struct_96_18_0d0905d3 *paVar58;
  ulong extraout_RDX_02;
  stbi_uc *extraout_RDX_03;
  stbi_uc *psVar59;
  stbi_uc *extraout_RDX_04;
  stbi_uc *extraout_RDX_05;
  int iVar60;
  ulong uVar61;
  stbi_uc *psVar62;
  byte *pbVar63;
  uint uVar64;
  ulong uVar65;
  int iVar66;
  stbi__uint32 sVar67;
  stbi__uint16 *__ptr;
  undefined4 in_register_00000084;
  stbi__result_info *ri_00;
  int iVar68;
  uint uVar69;
  int *piVar70;
  int iVar71;
  ulong uVar72;
  stbi__uint16 *psVar73;
  uint uVar74;
  uint uVar75;
  short *psVar76;
  stbi_uc (*pasVar77) [4];
  stbi__context *psVar78;
  long in_FS_OFFSET;
  bool bVar79;
  undefined1 auVar80 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  stbi_uc *coutput [4];
  short data [64];
  uint local_89b0;
  ulong local_8988;
  uint local_8978;
  int local_8964;
  uint local_8944;
  int local_8940;
  undefined1 local_8938 [12];
  uint uStack_892c;
  undefined1 local_8928 [16];
  int local_8918;
  stbi_uc *local_8910;
  stbi__jpeg *local_8908;
  undefined4 local_88fc;
  int local_88f8;
  int local_88f4;
  undefined8 local_88f0;
  ulong local_88e8;
  stbi__uint32 local_88dc;
  int local_88d8;
  int local_88d4;
  int local_88d0;
  int local_88cc;
  int local_88c8;
  int local_88c4;
  ulong local_88c0;
  ulong local_88b8;
  ulong local_88b0;
  stbi__gif local_88a8;
  
  psVar59 = (stbi_uc *)CONCAT44(in_register_00000084,req_comp);
  ri->bits_per_channel = 8;
  ri->num_channels = 0;
  ri->channel_order = 0;
  ri_00 = ri;
  psVar44 = (stbi__jpeg *)malloc(0x4888);
  psVar44->s = s;
  psVar44->idct_block_kernel = stbi__idct_simd;
  psVar44->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
  psVar44->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
  psVar44->jfif = 0;
  psVar44->app14_color_transform = -1;
  psVar44->marker = 0xff;
  sVar38 = stbi__get_marker(psVar44);
  if (sVar38 != 0xd8) {
    *(char **)(in_FS_OFFSET + -0x10) = "no SOI";
  }
  s->img_buffer = s->img_buffer_original;
  s->img_buffer_end = s->img_buffer_original_end;
  free(psVar44);
  if (sVar38 == 0xd8) {
    psVar44 = (stbi__jpeg *)malloc(0x4888);
    psVar44->s = s;
    psVar44->idct_block_kernel = stbi__idct_simd;
    psVar44->YCbCr_to_RGB_kernel = stbi__YCbCr_to_RGB_simd;
    psVar44->resample_row_hv_2_kernel = stbi__resample_row_hv_2_simd;
    s->img_n = 0;
    if ((uint)req_comp < 5) {
      psVar44->img_comp[0].raw_data = (void *)0x0;
      psVar44->img_comp[0].raw_coeff = (void *)0x0;
      psVar44->img_comp[1].raw_data = (void *)0x0;
      psVar44->img_comp[1].raw_coeff = (void *)0x0;
      psVar44->img_comp[2].raw_data = (void *)0x0;
      psVar44->img_comp[2].raw_coeff = (void *)0x0;
      psVar44->img_comp[3].raw_data = (void *)0x0;
      psVar44->img_comp[3].raw_coeff = (void *)0x0;
      psVar44->restart_interval = 0;
      iVar40 = stbi__decode_jpeg_header(psVar44,0);
      uVar74 = extraout_EDX;
      if (iVar40 != 0) {
        paVar1 = psVar44->img_comp;
        bVar39 = stbi__get_marker(psVar44);
LAB_00142c2e:
        if (bVar39 == 0xda) {
          iVar40 = stbi__get16be(psVar44->s);
          psVar50 = psVar44->s;
          pbVar63 = psVar50->img_buffer;
          paVar58 = extraout_RDX_00;
          if (psVar50->img_buffer_end <= pbVar63) {
            if (psVar50->read_from_callbacks != 0) {
              psVar59 = psVar50->buffer_start;
              iVar60 = (*(psVar50->io).read)(psVar50->io_user_data,(char *)psVar59,psVar50->buflen);
              if (iVar60 == 0) {
                psVar50->read_from_callbacks = 0;
                psVar62 = psVar50->buffer_start + 1;
                psVar50->buffer_start[0] = '\0';
                bVar39 = 0;
              }
              else {
                psVar62 = psVar59 + iVar60;
                bVar39 = *psVar59;
              }
              psVar50->img_buffer_end = psVar62;
              psVar50->img_buffer = psVar50->buffer_start + 1;
              paVar58 = extraout_RDX_01;
              goto LAB_00142d13;
            }
            psVar44->scan_n = 0;
LAB_00144849:
            pcVar45 = "bad SOS component count";
            goto LAB_00144850;
          }
          psVar50->img_buffer = pbVar63 + 1;
          bVar39 = *pbVar63;
LAB_00142d13:
          uVar74 = (uint)bVar39;
          psVar44->scan_n = uVar74;
          if (((byte)(bVar39 - 5) < 0xfc) || (psVar50 = psVar44->s, psVar50->img_n < (int)uVar74))
          goto LAB_00144849;
          if (iVar40 != uVar74 * 2 + 6) {
            pcVar45 = "bad SOS len";
            goto LAB_00144850;
          }
          lVar56 = 0;
          do {
            pbVar46 = psVar50->img_buffer;
            pbVar63 = psVar50->img_buffer_end;
            if (pbVar46 < pbVar63) {
              psVar50->img_buffer = pbVar46 + 1;
              uVar43 = (uint)*pbVar46;
              pbVar46 = pbVar46 + 1;
            }
            else if (psVar50->read_from_callbacks == 0) {
              uVar43 = 0;
            }
            else {
              psVar59 = psVar50->buffer_start;
              iVar40 = (*(psVar50->io).read)(psVar50->io_user_data,(char *)psVar59,psVar50->buflen);
              if (iVar40 == 0) {
                psVar50->read_from_callbacks = 0;
                psVar62 = psVar50->buffer_start + 1;
                psVar50->buffer_start[0] = '\0';
                uVar43 = 0;
              }
              else {
                psVar62 = psVar59 + iVar40;
                uVar43 = (uint)*psVar59;
              }
              psVar50->img_buffer_end = psVar62;
              psVar50->img_buffer = psVar50->buffer_start + 1;
              psVar50 = psVar44->s;
              pbVar46 = psVar50->img_buffer;
              pbVar63 = psVar50->img_buffer_end;
            }
            if (pbVar46 < pbVar63) {
              psVar50->img_buffer = pbVar46 + 1;
              uVar64 = (uint)*pbVar46;
            }
            else if (psVar50->read_from_callbacks == 0) {
              uVar64 = 0;
            }
            else {
              psVar59 = psVar50->buffer_start;
              iVar40 = (*(psVar50->io).read)(psVar50->io_user_data,(char *)psVar59,psVar50->buflen);
              if (iVar40 == 0) {
                psVar50->read_from_callbacks = 0;
                psVar62 = psVar50->buffer_start + 1;
                psVar50->buffer_start[0] = '\0';
                uVar64 = 0;
              }
              else {
                psVar62 = psVar59 + iVar40;
                uVar64 = (uint)*psVar59;
              }
              psVar50->img_buffer_end = psVar62;
              psVar50->img_buffer = psVar50->buffer_start + 1;
              psVar50 = psVar44->s;
            }
            uVar74 = psVar50->img_n;
            if ((long)(int)uVar74 < 1) {
              uVar65 = 0;
            }
            else {
              uVar65 = 0;
              paVar58 = paVar1;
              while (paVar58->id != uVar43) {
                uVar65 = uVar65 + 1;
                paVar58 = paVar58 + 1;
                if ((long)(int)uVar74 == uVar65) goto LAB_00144859;
              }
            }
            if ((uint)uVar65 == uVar74) goto LAB_00144859;
            uVar47 = uVar65 & 0xffffffff;
            paVar58 = (anon_struct_96_18_0d0905d3 *)(uVar47 * 0x60);
            psVar44->img_comp[uVar47].hd = uVar64 >> 4;
            if (0x3f < (byte)uVar64) {
              pcVar45 = "bad DC huff";
              goto LAB_00144850;
            }
            paVar58 = paVar1 + uVar47;
            paVar58->ha = uVar64 & 0xf;
            if (3 < (uVar64 & 0xf)) {
              pcVar45 = "bad AC huff";
              goto LAB_00144850;
            }
            psVar44->order[lVar56] = (uint)uVar65;
            lVar56 = lVar56 + 1;
          } while (lVar56 < psVar44->scan_n);
          pbVar63 = psVar50->img_buffer;
          pbVar46 = psVar50->img_buffer_end;
          if (pbVar63 < pbVar46) {
            psVar50->img_buffer = pbVar63 + 1;
            bVar39 = *pbVar63;
            pbVar63 = pbVar63 + 1;
          }
          else if (psVar50->read_from_callbacks == 0) {
            bVar39 = 0;
          }
          else {
            psVar59 = psVar50->buffer_start;
            iVar40 = (*(psVar50->io).read)(psVar50->io_user_data,(char *)psVar59,psVar50->buflen);
            if (iVar40 == 0) {
              psVar50->read_from_callbacks = 0;
              psVar62 = psVar50->buffer_start + 1;
              psVar50->buffer_start[0] = '\0';
              bVar39 = 0;
            }
            else {
              psVar62 = psVar59 + iVar40;
              bVar39 = *psVar59;
            }
            psVar50->img_buffer_end = psVar62;
            psVar50->img_buffer = psVar50->buffer_start + 1;
            psVar50 = psVar44->s;
            pbVar63 = psVar50->img_buffer;
            pbVar46 = psVar50->img_buffer_end;
          }
          psVar44->spec_start = (uint)bVar39;
          if (pbVar63 < pbVar46) {
            psVar50->img_buffer = pbVar63 + 1;
            uVar74 = (uint)*pbVar63;
            pbVar63 = pbVar63 + 1;
          }
          else if (psVar50->read_from_callbacks == 0) {
            uVar74 = 0;
          }
          else {
            psVar59 = psVar50->buffer_start;
            iVar40 = (*(psVar50->io).read)(psVar50->io_user_data,(char *)psVar59,psVar50->buflen);
            if (iVar40 == 0) {
              psVar50->read_from_callbacks = 0;
              psVar62 = psVar50->buffer_start + 1;
              psVar50->buffer_start[0] = '\0';
              uVar74 = 0;
            }
            else {
              psVar62 = psVar59 + iVar40;
              uVar74 = (uint)*psVar59;
            }
            psVar50->img_buffer_end = psVar62;
            psVar50->img_buffer = psVar50->buffer_start + 1;
            psVar50 = psVar44->s;
            pbVar63 = psVar50->img_buffer;
            pbVar46 = psVar50->img_buffer_end;
          }
          psVar44->spec_end = uVar74;
          if (pbVar63 < pbVar46) {
            psVar50->img_buffer = pbVar63 + 1;
            uVar74 = (uint)*pbVar63;
          }
          else if (psVar50->read_from_callbacks == 0) {
            uVar74 = 0;
          }
          else {
            psVar59 = psVar50->buffer_start;
            iVar40 = (*(psVar50->io).read)(psVar50->io_user_data,(char *)psVar59,psVar50->buflen);
            if (iVar40 == 0) {
              psVar50->read_from_callbacks = 0;
              psVar62 = psVar50->buffer_start + 1;
              psVar50->buffer_start[0] = '\0';
              uVar74 = 0;
            }
            else {
              psVar62 = psVar59 + iVar40;
              uVar74 = (uint)*psVar59;
            }
            psVar50->img_buffer_end = psVar62;
            psVar50->img_buffer = psVar50->buffer_start + 1;
          }
          psVar44->succ_high = uVar74 >> 4;
          uVar43 = uVar74 & 0xf;
          paVar58 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar43;
          psVar44->succ_low = uVar43;
          iVar40 = psVar44->progressive;
          iVar60 = psVar44->spec_start;
          if (iVar40 == 0) {
            if ((iVar60 != 0) || ((0xf < (byte)uVar74 || (uVar43 != 0)))) {
LAB_00145afd:
              pcVar45 = "bad SOS";
              goto LAB_00144850;
            }
            psVar44->spec_end = 0x3f;
          }
          else if ((((0x3f < iVar60) || (0x3f < psVar44->spec_end)) || (psVar44->spec_end < iVar60))
                  || ((0xdf < (byte)uVar74 || (0xd < uVar43)))) goto LAB_00145afd;
          uVar74 = psVar44->scan_n;
          uVar65 = (ulong)uVar74;
          iVar60 = psVar44->restart_interval;
          if (iVar60 == 0) {
            iVar60 = 0x7fffffff;
          }
          psVar44->code_buffer = 0;
          psVar44->code_bits = 0;
          psVar44->nomore = 0;
          psVar44->img_comp[3].dc_pred = 0;
          psVar44->img_comp[2].dc_pred = 0;
          psVar44->img_comp[1].dc_pred = 0;
          psVar44->img_comp[0].dc_pred = 0;
          psVar44->marker = 0xff;
          psVar44->todo = iVar60;
          psVar44->eob_run = 0;
          if (iVar40 == 0) {
            if (uVar74 == 1) {
              iVar40 = psVar44->order[0];
              iVar60 = psVar44->img_comp[iVar40].y + 7 >> 3;
              bVar79 = true;
              uVar74 = 1;
              if (0 < iVar60) {
                uVar43 = paVar1[iVar40].x + 7 >> 3;
                iVar66 = 0;
                iVar68 = 0;
                do {
                  if (0 < (int)uVar43) {
                    lVar56 = 0;
                    do {
                      iVar53 = stbi__jpeg_decode_block
                                         (psVar44,(short *)&local_88a8,
                                          (stbi__huffman *)psVar44->huff_dc[paVar1[iVar40].hd].fast,
                                          (stbi__huffman *)psVar44->huff_ac[paVar1[iVar40].ha].fast,
                                          psVar44->fast_ac[paVar1[iVar40].ha],iVar40,
                                          psVar44->dequant[paVar1[iVar40].tq]);
                      uVar74 = extraout_EDX_02;
                      if (iVar53 == 0) goto LAB_00143f0b;
                      (*psVar44->idct_block_kernel)
                                (paVar1[iVar40].data + lVar56 + iVar66 * paVar1[iVar40].w2,
                                 paVar1[iVar40].w2,(short *)&local_88a8);
                      uVar74 = (uint)extraout_RDX_02;
                      iVar53 = psVar44->todo;
                      psVar44->todo = iVar53 + -1;
                      uVar65 = extraout_RDX_02;
                      if (iVar53 < 2) {
                        if (psVar44->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar44);
                          uVar74 = extraout_EDX_03;
                        }
                        if ((psVar44->marker & 0xf8) != 0xd0) goto LAB_00143f04;
                        psVar44->code_buffer = 0;
                        psVar44->code_bits = 0;
                        psVar44->nomore = 0;
                        psVar44->img_comp[3].dc_pred = 0;
                        psVar44->img_comp[2].dc_pred = 0;
                        psVar44->img_comp[1].dc_pred = 0;
                        psVar44->img_comp[0].dc_pred = 0;
                        psVar44->marker = 0xff;
                        iVar53 = psVar44->restart_interval;
                        uVar65 = 0x7fffffff;
                        if (iVar53 == 0) {
                          iVar53 = 0x7fffffff;
                        }
                        psVar44->todo = iVar53;
                        psVar44->eob_run = 0;
                      }
                      lVar56 = lVar56 + 8;
                    } while ((ulong)uVar43 * 8 != lVar56);
                  }
                  uVar74 = (uint)uVar65;
                  iVar68 = iVar68 + 1;
                  iVar66 = iVar66 + 8;
                } while (iVar68 != iVar60);
LAB_00143f04:
                bVar79 = true;
              }
            }
            else {
              uVar74 = psVar44->img_mcu_y;
              uVar65 = (ulong)uVar74;
              bVar79 = true;
              if (0 < (int)uVar74) {
                iVar40 = psVar44->img_mcu_x;
                iVar68 = 0;
                do {
                  if (0 < iVar40) {
                    uVar43 = 0;
                    do {
                      iVar40 = psVar44->scan_n;
                      if (0 < iVar40) {
                        uVar65 = 0;
                        do {
                          iVar60 = psVar44->order[uVar65];
                          iVar66 = psVar44->img_comp[iVar60].v;
                          if (0 < iVar66) {
                            iVar40 = paVar1[iVar60].h;
                            iVar53 = 0;
                            do {
                              if (0 < iVar40) {
                                iVar66 = 0;
                                do {
                                  iVar71 = paVar1[iVar60].v;
                                  iVar42 = stbi__jpeg_decode_block
                                                     (psVar44,(short *)&local_88a8,
                                                      (stbi__huffman *)
                                                      psVar44->huff_dc[paVar1[iVar60].hd].fast,
                                                      (stbi__huffman *)
                                                      psVar44->huff_ac[paVar1[iVar60].ha].fast,
                                                      psVar44->fast_ac[paVar1[iVar60].ha],iVar60,
                                                      psVar44->dequant[paVar1[iVar60].tq]);
                                  uVar74 = extraout_EDX_05;
                                  if (iVar42 == 0) goto LAB_00143f0b;
                                  (*psVar44->idct_block_kernel)
                                            (paVar1[iVar60].data +
                                             (long)(int)((iVar40 * uVar43 + iVar66) * 8) +
                                             (long)((iVar71 * iVar68 + iVar53) * paVar1[iVar60].w2 *
                                                   8),paVar1[iVar60].w2,(short *)&local_88a8);
                                  iVar66 = iVar66 + 1;
                                  iVar40 = paVar1[iVar60].h;
                                } while (iVar66 < iVar40);
                                iVar66 = paVar1[iVar60].v;
                              }
                              iVar53 = iVar53 + 1;
                            } while (iVar53 < iVar66);
                            iVar40 = psVar44->scan_n;
                          }
                          uVar65 = uVar65 + 1;
                        } while ((long)uVar65 < (long)iVar40);
                        iVar60 = psVar44->todo;
                      }
                      uVar74 = (uint)uVar65;
                      psVar44->todo = iVar60 + -1;
                      bVar79 = iVar60 < 2;
                      iVar60 = iVar60 + -1;
                      if (bVar79) {
                        if (psVar44->code_bits < 0x18) {
                          stbi__grow_buffer_unsafe(psVar44);
                          uVar74 = extraout_EDX_06;
                        }
                        if ((psVar44->marker & 0xf8) != 0xd0) goto LAB_00143f04;
                        psVar44->code_buffer = 0;
                        psVar44->code_bits = 0;
                        psVar44->nomore = 0;
                        psVar44->img_comp[3].dc_pred = 0;
                        psVar44->img_comp[2].dc_pred = 0;
                        psVar44->img_comp[1].dc_pred = 0;
                        psVar44->img_comp[0].dc_pred = 0;
                        psVar44->marker = 0xff;
                        iVar60 = psVar44->restart_interval;
                        if (iVar60 == 0) {
                          iVar60 = 0x7fffffff;
                        }
                        psVar44->todo = iVar60;
                        psVar44->eob_run = 0;
                      }
                      uVar43 = uVar43 + 1;
                      uVar65 = (ulong)uVar43;
                      iVar40 = psVar44->img_mcu_x;
                    } while ((int)uVar43 < iVar40);
                    uVar65 = (ulong)(uint)psVar44->img_mcu_y;
                  }
                  iVar68 = iVar68 + 1;
                  uVar74 = (uint)uVar65;
                } while (iVar68 < (int)uVar74);
                goto LAB_00143f04;
              }
            }
            goto LAB_00143f0d;
          }
          if (uVar74 == 1) {
            local_88e8 = (ulong)psVar44->order[0];
            local_88f8 = psVar44->img_comp[local_88e8].y + 7 >> 3;
            if (0 < local_88f8) {
              local_88f0 = paVar1 + local_88e8;
              iVar40 = psVar44->img_comp[local_88e8].x + 7 >> 3;
              local_8964 = 0;
              do {
                if (0 < iVar40) {
                  iVar60 = 0;
                  do {
                    psVar76 = local_88f0->coeff + (local_88f0->coeff_w * local_8964 + iVar60) * 0x40
                    ;
                    uVar65 = (ulong)psVar44->spec_start;
                    local_8910 = (stbi_uc *)CONCAT44(local_8910._4_4_,iVar60);
                    if (uVar65 == 0) {
                      iVar60 = stbi__jpeg_decode_block_prog_dc
                                         (psVar44,psVar76,
                                          (stbi__huffman *)psVar44->huff_dc[local_88f0->hd].fast,
                                          (int)local_88e8);
                      uVar74 = extraout_EDX_01;
                      if (iVar60 == 0) goto LAB_00144859;
                    }
                    else {
                      iVar60 = local_88f0->ha;
                      iVar68 = psVar44->eob_run;
                      bVar39 = (byte)psVar44->succ_low;
                      if (psVar44->succ_high == 0) {
                        if (iVar68 == 0) {
                          paVar58 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar44->code_bits;
                          do {
                            if ((int)paVar58 < 0x10) {
                              stbi__grow_buffer_unsafe(psVar44);
                            }
                            uVar74 = psVar44->code_buffer;
                            uVar47 = (ulong)(uVar74 >> 0x17);
                            sVar4 = psVar44->fast_ac[iVar60][uVar47];
                            uVar43 = (uint)sVar4;
                            iVar68 = (int)uVar65;
                            if (sVar4 == 0) {
                              if (psVar44->code_bits < 0x10) {
                                stbi__grow_buffer_unsafe(psVar44);
                                uVar74 = psVar44->code_buffer;
                                uVar47 = (ulong)(uVar74 >> 0x17);
                              }
                              uVar65 = (ulong)psVar44->huff_ac[iVar60].fast[uVar47];
                              if (uVar65 == 0xff) {
                                lVar56 = 0;
                                do {
                                  lVar55 = lVar56;
                                  lVar56 = lVar55 + 1;
                                } while (psVar44->huff_ac[iVar60].maxcode[lVar55 + 10] <=
                                         uVar74 >> 0x10);
                                uVar43 = psVar44->code_bits;
                                paVar58 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar43;
                                if (lVar56 == 8) goto LAB_001465b9;
                                if ((int)uVar43 < (int)(lVar55 + 10)) goto LAB_001465c4;
                                uVar64 = stbi__bmask[lVar55 + 10];
                                iVar66 = psVar44->huff_ac[iVar60].delta[lVar55 + 10];
                                sVar41 = uVar74 << ((byte)(lVar55 + 10) & 0x1f);
                                uVar43 = (uVar43 - (int)lVar56) - 9;
                                paVar58 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar43;
                                psVar44->code_bits = uVar43;
                                psVar44->code_buffer = sVar41;
                                uVar65 = (ulong)(int)((uVar74 >> (0x17U - (char)lVar56 & 0x1f) &
                                                      uVar64) + iVar66);
                              }
                              else {
                                bVar2 = psVar44->huff_ac[iVar60].size[uVar65];
                                uVar43 = psVar44->code_bits - (uint)bVar2;
                                paVar58 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar43;
                                if (psVar44->code_bits < (int)(uint)bVar2) goto LAB_001465c4;
                                sVar41 = uVar74 << (bVar2 & 0x1f);
                                psVar44->code_buffer = sVar41;
                                psVar44->code_bits = uVar43;
                              }
                              bVar2 = psVar44->huff_ac[iVar60].values[uVar65];
                              uVar74 = bVar2 & 0xf;
                              bVar29 = bVar2 >> 4;
                              uVar43 = (uint)bVar29;
                              iVar66 = (int)paVar58;
                              if ((bVar2 & 0xf) == 0) {
                                if (bVar2 < 0xf0) {
                                  iVar68 = 1 << bVar29;
                                  psVar44->eob_run = iVar68;
                                  if (0xf < bVar2) {
                                    if (iVar66 < (int)uVar43) {
                                      stbi__grow_buffer_unsafe(psVar44);
                                      sVar41 = psVar44->code_buffer;
                                      iVar66 = psVar44->code_bits;
                                      iVar68 = psVar44->eob_run;
                                    }
                                    uVar64 = sVar41 << bVar29 | sVar41 >> 0x20 - bVar29;
                                    uVar74 = stbi__bmask[uVar43];
                                    psVar44->code_buffer = ~uVar74 & uVar64;
                                    iVar68 = iVar68 + (uVar64 & uVar74);
                                    psVar44->code_bits = iVar66 - uVar43;
                                  }
                                  goto LAB_00143307;
                                }
                                uVar74 = iVar68 + 0x10;
                              }
                              else {
                                lVar56 = (long)iVar68 + (ulong)uVar43;
                                bVar2 = ""[lVar56];
                                if (iVar66 < (int)uVar74) {
                                  stbi__grow_buffer_unsafe(psVar44);
                                  sVar41 = psVar44->code_buffer;
                                  iVar66 = psVar44->code_bits;
                                }
                                uVar64 = sVar41 << (sbyte)uVar74 | sVar41 >> 0x20 - (sbyte)uVar74;
                                uVar43 = *(uint *)((long)stbi__bmask + (ulong)(uVar74 * 4));
                                psVar44->code_buffer = ~uVar43 & uVar64;
                                paVar58 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar66 - uVar74);
                                psVar44->code_bits = iVar66 - uVar74;
                                iVar68 = 0;
                                if (-1 < (int)sVar41) {
                                  iVar68 = *(int *)((long)stbi__jbias + (ulong)(uVar74 * 4));
                                }
                                uVar74 = (int)lVar56 + 1;
                                psVar76[bVar2] =
                                     (short)((uVar43 & uVar64) + iVar68 << (bVar39 & 0x1f));
                              }
                            }
                            else {
                              lVar56 = (long)iVar68 + (ulong)(uVar43 >> 4 & 0xf);
                              psVar44->code_buffer = uVar74 << (sbyte)(uVar43 & 0xf);
                              uVar74 = psVar44->code_bits - (uVar43 & 0xf);
                              paVar58 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar74;
                              psVar44->code_bits = uVar74;
                              uVar74 = (int)lVar56 + 1;
                              psVar76[""[lVar56]] = (short)((uVar43 >> 8) << (bVar39 & 0x1f));
                            }
                            uVar65 = (ulong)uVar74;
                          } while ((int)uVar74 <= psVar44->spec_end);
                        }
                        else {
LAB_00143307:
                          psVar44->eob_run = iVar68 + -1;
                        }
                      }
                      else if (iVar68 == 0) {
                        iVar68 = 0x10000 << (bVar39 & 0x1f);
                        paVar58 = (anon_struct_96_18_0d0905d3 *)(ulong)(uint)psVar44->code_bits;
                        do {
                          if ((int)paVar58 < 0x10) {
                            stbi__grow_buffer_unsafe(psVar44);
                          }
                          uVar74 = psVar44->code_buffer;
                          uVar47 = (ulong)psVar44->huff_ac[iVar60].fast[uVar74 >> 0x17];
                          if (uVar47 == 0xff) {
                            lVar56 = 0;
                            do {
                              lVar55 = lVar56;
                              lVar56 = lVar55 + 1;
                            } while (psVar44->huff_ac[iVar60].maxcode[lVar55 + 10] <= uVar74 >> 0x10
                                    );
                            uVar43 = psVar44->code_bits;
                            paVar58 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar43;
                            if (lVar56 == 8) goto LAB_001465b9;
                            if ((int)uVar43 < (int)(lVar55 + 10)) goto LAB_001465c4;
                            uVar64 = stbi__bmask[lVar55 + 10];
                            iVar66 = psVar44->huff_ac[iVar60].delta[lVar55 + 10];
                            sVar41 = uVar74 << ((byte)(lVar55 + 10) & 0x1f);
                            uVar43 = (uVar43 - (int)lVar56) - 9;
                            paVar58 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar43;
                            psVar44->code_bits = uVar43;
                            psVar44->code_buffer = sVar41;
                            uVar47 = (ulong)(int)((uVar74 >> (0x17U - (char)lVar56 & 0x1f) & uVar64)
                                                 + iVar66);
                          }
                          else {
                            bVar2 = psVar44->huff_ac[iVar60].size[uVar47];
                            uVar43 = psVar44->code_bits - (uint)bVar2;
                            paVar58 = (anon_struct_96_18_0d0905d3 *)(ulong)uVar43;
                            if (psVar44->code_bits < (int)(uint)bVar2) goto LAB_001465c4;
                            sVar41 = uVar74 << (bVar2 & 0x1f);
                            psVar44->code_buffer = sVar41;
                            psVar44->code_bits = uVar43;
                          }
                          iVar66 = (int)paVar58;
                          bVar2 = psVar44->huff_ac[iVar60].values[uVar47];
                          bVar29 = bVar2 >> 4;
                          uVar74 = (uint)bVar29;
                          uVar47 = (ulong)uVar74;
                          if ((bVar2 & 0xf) == 1) {
                            if (iVar66 < 1) {
                              stbi__grow_buffer_unsafe(psVar44);
                              sVar41 = psVar44->code_buffer;
                              iVar66 = psVar44->code_bits;
                            }
                            sVar67 = sVar41 * 2;
                            psVar44->code_buffer = sVar67;
                            paVar58 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar66 - 1U);
                            iVar53 = ((int)~sVar41 >> 0x1f | 1U) << (bVar39 & 0x1f);
                            psVar44->code_bits = iVar66 - 1U;
                          }
                          else {
                            if ((bVar2 & 0xf) != 0) goto LAB_001465c4;
                            if (bVar2 < 0xf0) {
                              uVar43 = ~(-1 << bVar29);
                              psVar44->eob_run = uVar43;
                              uVar61 = 0x40;
                              if (0xf < bVar2) {
                                if (iVar66 < (int)uVar74) {
                                  stbi__grow_buffer_unsafe(psVar44);
                                  sVar41 = psVar44->code_buffer;
                                  iVar66 = psVar44->code_bits;
                                  uVar43 = psVar44->eob_run;
                                }
                                uVar57 = sVar41 << bVar29 | sVar41 >> 0x20 - bVar29;
                                uVar64 = stbi__bmask[uVar47];
                                sVar67 = ~uVar64 & uVar57;
                                psVar44->code_buffer = sVar67;
                                paVar58 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar66 - uVar74);
                                psVar44->code_bits = iVar66 - uVar74;
                                psVar44->eob_run = (uVar57 & uVar64) + uVar43;
                                iVar53 = 0;
                                uVar47 = uVar61;
                                goto LAB_001434f9;
                              }
                            }
                            else {
                              uVar61 = 0xf;
                            }
                            iVar53 = 0;
                            uVar47 = uVar61;
                            sVar67 = sVar41;
                          }
LAB_001434f9:
                          uVar74 = psVar44->spec_end;
                          uVar61 = (ulong)uVar74;
                          if ((int)uVar65 <= (int)uVar74) {
                            uVar72 = (long)(int)uVar65;
                            local_88f4 = iVar53;
                            do {
                              uVar74 = (uint)uVar61;
                              iVar66 = (int)paVar58;
                              bVar2 = ""[uVar72];
                              if (psVar76[bVar2] == 0) {
                                if ((int)uVar47 == 0) {
                                  uVar65 = (ulong)((int)uVar72 + 1);
                                  psVar76[bVar2] = (short)local_88f4;
                                  break;
                                }
                                uVar47 = (ulong)((int)uVar47 - 1);
                              }
                              else {
                                if (iVar66 < 1) {
                                  stbi__grow_buffer_unsafe(psVar44);
                                  sVar67 = psVar44->code_buffer;
                                  iVar66 = psVar44->code_bits;
                                }
                                sVar41 = sVar67 * 2;
                                psVar44->code_buffer = sVar41;
                                paVar58 = (anon_struct_96_18_0d0905d3 *)(ulong)(iVar66 - 1U);
                                psVar44->code_bits = iVar66 - 1U;
                                bVar79 = (int)sVar67 < 0;
                                sVar67 = sVar41;
                                if ((bVar79) &&
                                   (sVar4 = psVar76[bVar2], (iVar68 >> 0x10 & (int)sVar4) == 0)) {
                                  sVar30 = (short)((uint)iVar68 >> 0x10);
                                  if (sVar4 < 1) {
                                    sVar30 = -sVar30;
                                  }
                                  psVar76[bVar2] = sVar4 + sVar30;
                                }
                              }
                              uVar65 = uVar72 + 1;
                              uVar74 = psVar44->spec_end;
                              uVar61 = (ulong)(int)uVar74;
                              bVar79 = (long)uVar72 < (long)uVar61;
                              uVar72 = uVar65;
                            } while (bVar79);
                          }
                        } while ((int)uVar65 <= (int)uVar74);
                      }
                      else {
                        psVar44->eob_run = iVar68 + -1;
                        if (psVar44->spec_start <= psVar44->spec_end) {
                          uVar74 = (0x10000 << (bVar39 & 0x1f)) >> 0x10;
                          do {
                            bVar39 = ""[uVar65];
                            if (psVar76[bVar39] != 0) {
                              iVar60 = psVar44->code_bits;
                              if (iVar60 < 1) {
                                stbi__grow_buffer_unsafe(psVar44);
                                iVar60 = psVar44->code_bits;
                              }
                              sVar41 = psVar44->code_buffer;
                              psVar44->code_buffer = sVar41 * 2;
                              psVar44->code_bits = iVar60 + -1;
                              if (((int)sVar41 < 0) &&
                                 (sVar4 = psVar76[bVar39], (uVar74 & (int)sVar4) == 0)) {
                                uVar43 = -uVar74;
                                if (0 < sVar4) {
                                  uVar43 = uVar74;
                                }
                                psVar76[bVar39] = (short)uVar43 + sVar4;
                              }
                            }
                            bVar79 = (long)uVar65 < (long)psVar44->spec_end;
                            uVar65 = uVar65 + 1;
                          } while (bVar79);
                        }
                      }
                    }
                    iVar60 = psVar44->todo;
                    psVar44->todo = iVar60 + -1;
                    if (iVar60 < 2) {
                      if (psVar44->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar44);
                      }
                      bVar39 = psVar44->marker;
                      if ((bVar39 & 0xf8) != 0xd0) goto LAB_00143f1d;
                      psVar44->code_buffer = 0;
                      psVar44->code_bits = 0;
                      psVar44->nomore = 0;
                      psVar44->img_comp[3].dc_pred = 0;
                      psVar44->img_comp[2].dc_pred = 0;
                      psVar44->img_comp[1].dc_pred = 0;
                      psVar44->img_comp[0].dc_pred = 0;
                      psVar44->marker = 0xff;
                      iVar60 = psVar44->restart_interval;
                      if (iVar60 == 0) {
                        iVar60 = 0x7fffffff;
                      }
                      psVar44->todo = iVar60;
                      psVar44->eob_run = 0;
                    }
                    iVar60 = (int)local_8910 + 1;
                  } while (iVar60 != iVar40);
                }
                local_8964 = local_8964 + 1;
              } while (local_8964 != local_88f8);
            }
          }
          else {
            iVar40 = psVar44->img_mcu_y;
            if (0 < iVar40) {
              iVar68 = psVar44->img_mcu_x;
              iVar66 = 0;
              do {
                if (0 < iVar68) {
                  iVar40 = 0;
                  do {
                    iVar68 = psVar44->scan_n;
                    if (0 < iVar68) {
                      lVar56 = 0;
                      do {
                        iVar60 = psVar44->order[lVar56];
                        iVar53 = psVar44->img_comp[iVar60].v;
                        if (0 < iVar53) {
                          iVar68 = paVar1[iVar60].h;
                          iVar71 = 0;
                          do {
                            if (0 < iVar68) {
                              iVar53 = 0;
                              do {
                                iVar68 = stbi__jpeg_decode_block_prog_dc
                                                   (psVar44,paVar1[iVar60].coeff +
                                                            (iVar68 * iVar40 + iVar53 +
                                                            (paVar1[iVar60].v * iVar66 + iVar71) *
                                                            paVar1[iVar60].coeff_w) * 0x40,
                                                    (stbi__huffman *)
                                                    psVar44->huff_dc[paVar1[iVar60].hd].fast,iVar60)
                                ;
                                uVar74 = extraout_EDX_04;
                                if (iVar68 == 0) goto LAB_00144859;
                                iVar53 = iVar53 + 1;
                                iVar68 = paVar1[iVar60].h;
                              } while (iVar53 < iVar68);
                              iVar53 = paVar1[iVar60].v;
                            }
                            iVar71 = iVar71 + 1;
                          } while (iVar71 < iVar53);
                          iVar68 = psVar44->scan_n;
                        }
                        lVar56 = lVar56 + 1;
                      } while (lVar56 < iVar68);
                      iVar60 = psVar44->todo;
                    }
                    psVar44->todo = iVar60 + -1;
                    bVar79 = iVar60 < 2;
                    iVar60 = iVar60 + -1;
                    if (bVar79) {
                      if (psVar44->code_bits < 0x18) {
                        stbi__grow_buffer_unsafe(psVar44);
                      }
                      bVar39 = psVar44->marker;
                      if ((bVar39 & 0xf8) != 0xd0) goto LAB_00143f1d;
                      psVar44->code_buffer = 0;
                      psVar44->code_bits = 0;
                      psVar44->nomore = 0;
                      psVar44->img_comp[3].dc_pred = 0;
                      psVar44->img_comp[2].dc_pred = 0;
                      psVar44->img_comp[1].dc_pred = 0;
                      psVar44->img_comp[0].dc_pred = 0;
                      psVar44->marker = 0xff;
                      iVar60 = psVar44->restart_interval;
                      if (iVar60 == 0) {
                        iVar60 = 0x7fffffff;
                      }
                      psVar44->todo = iVar60;
                      psVar44->eob_run = 0;
                    }
                    iVar40 = iVar40 + 1;
                    iVar68 = psVar44->img_mcu_x;
                  } while (iVar40 < iVar68);
                  iVar40 = psVar44->img_mcu_y;
                }
                iVar66 = iVar66 + 1;
              } while (iVar66 < iVar40);
            }
          }
          goto LAB_00143f15;
        }
        uVar74 = (uint)bVar39;
        if (uVar74 == 0xdc) {
          iVar40 = stbi__get16be(psVar44->s);
          sVar41 = stbi__get16be(psVar44->s);
          paVar58 = extraout_RDX;
          if (iVar40 == 4) {
            if (sVar41 == psVar44->s->img_y) goto LAB_00142c84;
            pcVar45 = "bad DNL height";
          }
          else {
            pcVar45 = "bad DNL len";
          }
          goto LAB_00144850;
        }
        if (uVar74 == 0xd9) {
          psVar78 = psVar44->s;
          uVar74 = psVar78->img_n;
          if (psVar44->progressive == 0) goto LAB_001446f3;
          if (0 < (int)uVar74) {
            lVar56 = 0;
            do {
              iVar40 = psVar44->img_comp[lVar56].y + 7 >> 3;
              if (0 < iVar40) {
                uVar74 = paVar1[lVar56].x + 7 >> 3;
                iVar60 = 0;
                do {
                  if (0 < (int)uVar74) {
                    uVar65 = 0;
                    do {
                      psVar76 = paVar1[lVar56].coeff +
                                (paVar1[lVar56].coeff_w * iVar60 + (int)uVar65) * 0x40;
                      iVar68 = paVar1[lVar56].tq;
                      lVar55 = 0;
                      do {
                        psVar76[lVar55] = psVar76[lVar55] * psVar44->dequant[iVar68][lVar55];
                        lVar55 = lVar55 + 1;
                      } while (lVar55 != 0x40);
                      (*psVar44->idct_block_kernel)
                                (paVar1[lVar56].data +
                                 uVar65 * 8 + (long)(iVar60 * 8 * paVar1[lVar56].w2),
                                 paVar1[lVar56].w2,psVar76);
                      uVar65 = uVar65 + 1;
                    } while (uVar65 != uVar74);
                  }
                  iVar60 = iVar60 + 1;
                } while (iVar60 != iVar40);
                psVar78 = psVar44->s;
              }
              lVar56 = lVar56 + 1;
              uVar74 = psVar78->img_n;
            } while (lVar56 < (int)uVar74);
LAB_001446f3:
            uVar43 = (2 < (int)uVar74) + 1 + (uint)(2 < (int)uVar74);
            if (req_comp != 0) {
              uVar43 = req_comp;
            }
            if (uVar74 == 3) {
              bVar79 = true;
              uVar64 = 3;
              if (psVar44->rgb != 3) {
                uVar74 = 3;
                if (psVar44->app14_color_transform != 0) goto LAB_00144b03;
                bVar79 = psVar44->jfif == 0;
              }
            }
            else {
LAB_00144b03:
              uVar64 = uVar74;
              bVar79 = false;
            }
            uVar74 = 1;
            if (bVar79) {
              uVar74 = uVar64;
            }
            if (uVar64 != 3) {
              uVar74 = uVar64;
            }
            if (2 < (int)uVar43) {
              uVar74 = uVar64;
            }
            local_8928 = (undefined1  [16])0x0;
            _local_8938 = (undefined1  [16])0x0;
            sVar41 = psVar78->img_x;
            if (0 < (int)uVar74) {
              lVar56 = 0;
              while( true ) {
                pvVar48 = malloc((ulong)(sVar41 + 3));
                *(void **)((long)&psVar44->img_comp[0].linebuf + lVar56 * 2) = pvVar48;
                iVar40 = extraout_EDX_07;
                if (pvVar48 == (void *)0x0) break;
                uVar65 = (long)psVar44->img_h_max /
                         (long)*(int *)((long)&psVar44->img_comp[0].h + lVar56 * 2);
                iVar40 = (int)uVar65;
                *(int *)((long)(local_88a8.pal + -7) + lVar56) = iVar40;
                iVar60 = psVar44->img_v_max / *(int *)((long)&psVar44->img_comp[0].v + lVar56 * 2);
                *(int *)((long)(local_88a8.pal + -6) + lVar56) = iVar60;
                *(int *)((long)(local_88a8.pal + -4) + lVar56) = iVar60 >> 1;
                *(int *)((long)(local_88a8.pal + -5) + lVar56) =
                     (int)((ulong)((sVar41 - 1) + iVar40) / (uVar65 & 0xffffffff));
                *(undefined4 *)((long)(local_88a8.pal + -3) + lVar56) = 0;
                uVar7 = *(undefined8 *)((long)&psVar44->img_comp[0].data + lVar56 * 2);
                *(undefined8 *)((long)(local_88a8.pal + -9) + lVar56) = uVar7;
                *(undefined8 *)((long)(local_88a8.pal + -0xb) + lVar56) = uVar7;
                if (iVar40 == 2) {
                  pcVar49 = stbi__resample_row_h_2;
                  if (iVar60 != 1) {
                    if (iVar60 != 2) goto LAB_00144c45;
                    pcVar49 = psVar44->resample_row_hv_2_kernel;
                  }
                }
                else if (iVar40 == 1) {
                  pcVar49 = stbi__resample_row_generic;
                  if (iVar60 == 2) {
                    pcVar49 = stbi__resample_row_v_2;
                  }
                  if (iVar60 == 1) {
                    pcVar49 = resample_row_1;
                  }
                }
                else {
LAB_00144c45:
                  pcVar49 = stbi__resample_row_generic;
                }
                *(code **)((long)&((stbi__gif *)(local_88a8.pal + -0xd))->w + lVar56) = pcVar49;
                lVar56 = lVar56 + 0x30;
                if ((ulong)uVar74 * 0x30 == lVar56) goto LAB_00144c61;
              }
LAB_00145307:
              stbi__free_jpeg_components(psVar44,uVar64,iVar40);
              pcVar45 = "outofmem";
              goto LAB_00142b2b;
            }
LAB_00144c61:
            sVar67 = psVar78->img_y;
            psVar50 = (stbi__context *)stbi__malloc_mad3(uVar43,sVar41,sVar67,1);
            iVar40 = (int)extraout_RDX_03;
            if (psVar50 == (stbi__context *)0x0) goto LAB_00145307;
            if (sVar67 != 0) {
              paVar1 = psVar44->img_comp;
              local_8910 = (stbi_uc *)((long)&psVar50->img_x + 2);
              iVar60 = 0;
              uVar64 = 0;
              psVar59 = extraout_RDX_03;
              local_8908 = psVar44;
              do {
                sVar41 = psVar78->img_x;
                if (0 < (int)uVar74) {
                  pasVar77 = (stbi_uc (*) [4])&local_88a8.ratio;
                  uVar65 = 0;
                  piVar70 = &paVar1->y;
                  do {
                    asVar5 = pasVar77[-1];
                    asVar6 = pasVar77[-3];
                    iVar40 = (int)asVar6 >> 1;
                    auVar118 = (**(code **)(pasVar77 + -10))
                                         (*(stbi_uc **)(piVar70 + 10),
                                          *(undefined8 *)
                                           (*pasVar77 +
                                           ((ulong)(iVar40 <= (int)asVar5) << 3 | 0xffffffffffffffe0
                                           )),*(undefined8 *)
                                               (*pasVar77 +
                                               ((ulong)((int)asVar5 < iVar40) << 3 |
                                               0xffffffffffffffe0)),pasVar77[-2],pasVar77[-4]);
                    psVar59 = auVar118._8_8_;
                    *(long *)(local_8938 + uVar65 * 8) = auVar118._0_8_;
                    pasVar77[-1] = (stbi_uc  [4])((int)asVar5 + 1);
                    if ((int)asVar6 <= (int)asVar5 + 1) {
                      pasVar77[-1] = (stbi_uc  [4])0x0;
                      *(stbi_uc **)(pasVar77 + -8) = *(stbi_uc **)(pasVar77 + -6);
                      asVar5 = *pasVar77;
                      *pasVar77 = (stbi_uc  [4])((int)asVar5 + 1);
                      if ((int)asVar5 + 1 < *piVar70) {
                        *(stbi_uc **)(pasVar77 + -6) = *(stbi_uc **)(pasVar77 + -6) + piVar70[1];
                      }
                    }
                    uVar65 = uVar65 + 1;
                    piVar70 = piVar70 + 0x18;
                    pasVar77 = pasVar77 + 0xc;
                  } while (uVar74 != uVar65);
                }
                psVar44 = local_8908;
                if ((int)uVar43 < 3) {
                  psVar78 = local_8908->s;
                  if (bVar79) {
                    if (uVar43 == 1) {
                      if (psVar78->img_x != 0) {
                        uVar65 = 0;
                        do {
                          bVar39 = *(byte *)(local_8928._0_8_ + uVar65);
                          psVar50->buffer_start[uVar65 + sVar41 * iVar60 + -0x38] =
                               (stbi_uc)((uint)bVar39 * 2 + ((uint)bVar39 + (uint)bVar39 * 8) * 3 +
                                         (uint)stack0xffffffffffff76d0[uVar65] * 0x96 +
                                         (uint)*(byte *)(local_8938._0_8_ + uVar65) * 0x4d >> 8);
                          uVar65 = uVar65 + 1;
                          psVar59 = (stbi_uc *)local_8928._0_8_;
                        } while (uVar65 < psVar78->img_x);
                      }
                    }
                    else if (psVar78->img_x != 0) {
                      uVar65 = 0;
                      do {
                        bVar39 = *(byte *)(local_8928._0_8_ + uVar65);
                        psVar50->buffer_start[uVar65 * 2 + (ulong)(sVar41 * iVar60) + -0x38] =
                             (stbi_uc)((uint)bVar39 * 2 + ((uint)bVar39 + (uint)bVar39 * 8) * 3 +
                                       (uint)stack0xffffffffffff76d0[uVar65] * 0x96 +
                                       (uint)*(byte *)(local_8938._0_8_ + uVar65) * 0x4d >> 8);
                        psVar50->buffer_start[uVar65 * 2 + (ulong)(sVar41 * iVar60) + -0x37] = 0xff;
                        uVar65 = uVar65 + 1;
                        psVar59 = (stbi_uc *)local_8928._0_8_;
                      } while (uVar65 < psVar78->img_x);
                    }
                  }
                  else if (psVar78->img_n == 4) {
                    if (local_8908->app14_color_transform == 2) {
                      if (psVar78->img_x != 0) {
                        psVar62 = psVar50->buffer_start + ((ulong)(sVar41 * iVar60) - 0x37);
                        psVar59 = (stbi_uc *)0x0;
                        do {
                          iVar40 = (*(byte *)(local_8938._0_8_ + (long)psVar59) ^ 0xff) *
                                   (uint)psVar59[local_8928._8_8_];
                          psVar62[-1] = (char)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                          *psVar62 = 0xff;
                          psVar59 = psVar59 + 1;
                          psVar62 = psVar62 + uVar43;
                        } while (psVar59 < (stbi_uc *)(ulong)psVar78->img_x);
                      }
                    }
                    else {
                      if (local_8908->app14_color_transform != 0) goto LAB_001450b3;
                      if (psVar78->img_x != 0) {
                        psVar62 = psVar50->buffer_start + ((ulong)(sVar41 * iVar60) - 0x37);
                        uVar65 = 0;
                        do {
                          bVar39 = *(byte *)(local_8928._8_8_ + uVar65);
                          iVar40 = (uint)*(byte *)(local_8938._0_8_ + uVar65) * (uint)bVar39;
                          iVar68 = (uint)stack0xffffffffffff76d0[uVar65] * (uint)bVar39;
                          psVar62[-1] = (char)((((uint)*(byte *)(local_8928._0_8_ + uVar65) *
                                                 (uint)bVar39 + 0x80 >> 8) +
                                                (uint)*(byte *)(local_8928._0_8_ + uVar65) *
                                                (uint)bVar39 + 0x80 >> 8) * 0x1d +
                                               (iVar68 + (iVar68 + 0x80U >> 8) + 0x80 >> 8) * 0x96 +
                                               (iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8) * 0x4d
                                              >> 8);
                          *psVar62 = 0xff;
                          uVar65 = uVar65 + 1;
                          psVar62 = psVar62 + uVar43;
                          psVar59 = stack0xffffffffffff76d0;
                        } while (uVar65 < psVar78->img_x);
                      }
                    }
                  }
                  else {
LAB_001450b3:
                    if (uVar43 == 1) {
                      if (psVar78->img_x != 0) {
                        psVar62 = (stbi_uc *)0x0;
                        do {
                          (psVar50->buffer_start + ((ulong)(sVar41 * iVar60) - 0x38))[(long)psVar62]
                               = *(stbi_uc *)(local_8938._0_8_ + (long)psVar62);
                          psVar62 = psVar62 + 1;
                          psVar59 = (stbi_uc *)(ulong)psVar78->img_x;
                        } while (psVar62 < (stbi_uc *)(ulong)psVar78->img_x);
                      }
                    }
                    else if (psVar78->img_x != 0) {
                      psVar62 = (stbi_uc *)0x0;
                      do {
                        psVar50->buffer_start[(long)psVar62 * 2 + (ulong)(sVar41 * iVar60) + -0x38]
                             = *(stbi_uc *)(local_8938._0_8_ + (long)psVar62);
                        psVar50->buffer_start[(long)psVar62 * 2 + (ulong)(sVar41 * iVar60) + -0x37]
                             = 0xff;
                        psVar62 = psVar62 + 1;
                        psVar59 = (stbi_uc *)(ulong)psVar78->img_x;
                      } while (psVar62 < (stbi_uc *)(ulong)psVar78->img_x);
                    }
                  }
                }
                else {
                  psVar78 = local_8908->s;
                  if (psVar78->img_n == 3) {
                    if (bVar79) {
                      if (psVar78->img_x != 0) {
                        psVar62 = psVar50->buffer_start + ((ulong)(sVar41 * iVar60) - 0x35);
                        psVar59 = (stbi_uc *)0x0;
                        do {
                          psVar62[-3] = *(stbi_uc *)(local_8938._0_8_ + (long)psVar59);
                          psVar62[-2] = stack0xffffffffffff76d0[(long)psVar59];
                          psVar62[-1] = *(stbi_uc *)(local_8928._0_8_ + (long)psVar59);
                          *psVar62 = 0xff;
                          psVar59 = psVar59 + 1;
                          psVar62 = psVar62 + uVar43;
                        } while (psVar59 < (stbi_uc *)(ulong)psVar78->img_x);
                      }
                    }
                    else {
LAB_00145126:
                      (*local_8908->YCbCr_to_RGB_kernel)
                                (psVar50->buffer_start + ((ulong)(uVar64 * uVar43 * sVar41) - 0x38),
                                 (stbi_uc *)local_8938._0_8_,stack0xffffffffffff76d0,
                                 (stbi_uc *)local_8928._0_8_,psVar78->img_x,uVar43);
                      psVar78 = psVar44->s;
                      psVar59 = extraout_RDX_04;
                    }
                  }
                  else if (psVar78->img_n == 4) {
                    if (local_8908->app14_color_transform == 2) {
                      (*local_8908->YCbCr_to_RGB_kernel)
                                (psVar50->buffer_start + ((ulong)(uVar64 * uVar43 * sVar41) - 0x38),
                                 (stbi_uc *)local_8938._0_8_,stack0xffffffffffff76d0,
                                 (stbi_uc *)local_8928._0_8_,psVar78->img_x,uVar43);
                      psVar78 = psVar44->s;
                      psVar59 = extraout_RDX_05;
                      if (psVar78->img_x != 0) {
                        pbVar63 = local_8910 + sVar41 * iVar60;
                        uVar65 = 0;
                        do {
                          bVar39 = *(byte *)(local_8928._8_8_ + uVar65);
                          iVar40 = (pbVar63[-2] ^ 0xff) * (uint)bVar39;
                          pbVar63[-2] = (byte)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                          iVar40 = (pbVar63[-1] ^ 0xff) * (uint)bVar39;
                          pbVar63[-1] = (byte)(iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8);
                          iVar40 = (*pbVar63 ^ 0xff) * (uint)bVar39;
                          uVar57 = iVar40 + 0x80U >> 8;
                          *pbVar63 = (byte)(iVar40 + uVar57 + 0x80 >> 8);
                          uVar65 = uVar65 + 1;
                          pbVar63 = pbVar63 + uVar43;
                          psVar59 = (stbi_uc *)(ulong)uVar57;
                        } while (uVar65 < psVar78->img_x);
                      }
                    }
                    else {
                      if (local_8908->app14_color_transform != 0) goto LAB_00145126;
                      if (psVar78->img_x != 0) {
                        psVar62 = psVar50->buffer_start + ((ulong)(sVar41 * iVar60) - 0x35);
                        uVar65 = 0;
                        do {
                          bVar39 = *(byte *)(local_8928._8_8_ + uVar65);
                          iVar40 = (uint)*(byte *)(local_8938._0_8_ + uVar65) * (uint)bVar39;
                          psVar62[-3] = (char)((iVar40 + 0x80U >> 8) + iVar40 + 0x80 >> 8);
                          iVar40 = (uint)stack0xffffffffffff76d0[uVar65] * (uint)bVar39;
                          psVar62[-2] = (char)(iVar40 + (iVar40 + 0x80U >> 8) + 0x80 >> 8);
                          psVar62[-1] = (char)((uint)*(byte *)(local_8928._0_8_ + uVar65) *
                                               (uint)bVar39 +
                                               ((uint)*(byte *)(local_8928._0_8_ + uVar65) *
                                                (uint)bVar39 + 0x80 >> 8) + 0x80 >> 8);
                          *psVar62 = 0xff;
                          uVar65 = uVar65 + 1;
                          psVar62 = psVar62 + uVar43;
                          psVar59 = (stbi_uc *)local_8928._0_8_;
                        } while (uVar65 < psVar78->img_x);
                      }
                    }
                  }
                  else if (psVar78->img_x != 0) {
                    psVar62 = psVar50->buffer_start + ((ulong)(sVar41 * iVar60) - 0x35);
                    uVar65 = 0;
                    do {
                      sVar38 = *(stbi_uc *)(local_8938._0_8_ + uVar65);
                      psVar62[-1] = sVar38;
                      psVar62[-2] = sVar38;
                      psVar62[-3] = sVar38;
                      *psVar62 = 0xff;
                      uVar65 = uVar65 + 1;
                      psVar62 = psVar62 + uVar43;
                    } while (uVar65 < psVar78->img_x);
                  }
                }
                iVar40 = (int)psVar59;
                uVar64 = uVar64 + 1;
                iVar60 = iVar60 + uVar43;
              } while (uVar64 < psVar78->img_y);
              uVar64 = psVar78->img_n;
            }
            stbi__free_jpeg_components(psVar44,uVar64,iVar40);
            psVar78 = psVar44->s;
            *x = psVar78->img_x;
            *y = psVar78->img_y;
            if (comp != (int *)0x0) {
              *comp = (uint)(2 < psVar78->img_n) * 2 + 1;
            }
            goto LAB_0014486d;
          }
          uVar43 = req_comp + (uint)(req_comp == 0);
          goto LAB_00144b03;
        }
        iVar40 = stbi__process_marker(psVar44,uVar74);
        uVar74 = extraout_EDX_00;
        if (iVar40 != 0) goto LAB_00142c84;
      }
LAB_00144859:
      stbi__free_jpeg_components(psVar44,psVar44->s->img_n,uVar74);
    }
    else {
      pcVar45 = "bad req_comp";
LAB_00142b2b:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar45;
    }
    psVar50 = (stbi__context *)0x0;
LAB_0014486d:
    free(psVar44);
  }
  else {
    iVar40 = stbi__check_png_header(s);
    psVar54 = s->img_buffer_original;
    psVar62 = s->img_buffer_original_end;
    s->img_buffer = psVar54;
    s->img_buffer_end = psVar62;
    if (iVar40 == 0) {
      if (psVar54 < psVar62) {
        psVar51 = psVar54 + 1;
        s->img_buffer = psVar51;
        sVar38 = *psVar54;
LAB_00144137:
        if (sVar38 != 'B') goto LAB_0014431b;
        if (psVar51 < psVar62) {
          s->img_buffer = psVar51 + 1;
          sVar38 = *psVar51;
        }
        else {
          if (s->read_from_callbacks == 0) goto LAB_0014431b;
          psVar62 = s->buffer_start;
          iVar40 = (*(s->io).read)(s->io_user_data,(char *)psVar62,s->buflen);
          if (iVar40 == 0) {
            s->read_from_callbacks = 0;
            psVar54 = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
            sVar38 = '\0';
          }
          else {
            psVar54 = psVar62 + iVar40;
            sVar38 = *psVar62;
          }
          s->img_buffer_end = psVar54;
          s->img_buffer = s->buffer_start + 1;
        }
        if (sVar38 != 'M') goto LAB_0014431b;
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        stbi__get16le(s);
        uVar74 = stbi__get16le(s);
        iVar40 = stbi__get16le(s);
        uVar74 = iVar40 << 0x10 | uVar74;
        if (((0x38 < uVar74) || ((0x100010000001000U >> ((ulong)uVar74 & 0x3f) & 1) == 0)) &&
           (uVar74 != 0x6c)) {
          s->img_buffer = s->img_buffer_original;
          s->img_buffer_end = s->img_buffer_original_end;
          if (uVar74 == 0x7c) goto LAB_0014428a;
          goto LAB_0014432d;
        }
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
LAB_0014428a:
        local_8928._12_4_ = 0xff;
        pvVar48 = stbi__bmp_parse_header(s,(stbi__bmp_data *)local_8938);
        if (pvVar48 == (void *)0x0) goto LAB_00142b8a;
        local_88dc = s->img_y;
        sVar41 = -local_88dc;
        if (0 < (int)local_88dc) {
          sVar41 = local_88dc;
        }
        s->img_y = sVar41;
        z_00 = local_8928._8_4_;
        uVar37 = local_8938._8_4_;
        if (local_8938._8_4_ == 0xc) {
          if ((int)local_8938._0_4_ < 0x18) {
            uVar74 = ((local_8938._4_4_ - local_8918) + -0x18) / 3;
            goto LAB_00144477;
          }
LAB_00144483:
          local_8988 = 0;
          if (local_8938._0_4_ != 0x18 || local_8928._8_4_ != 0xff000000) goto LAB_001444b6;
          local_8988 = 0;
          iVar40 = 3;
          iVar60 = 0x18;
          bVar79 = true;
        }
        else {
          if (0xf < (int)local_8938._0_4_) goto LAB_00144483;
          uVar74 = local_8938._4_4_ - (local_8918 + local_8938._8_4_) >> 2;
LAB_00144477:
          local_8988 = (ulong)uVar74;
LAB_001444b6:
          bVar79 = local_8928._8_4_ == 0xff000000;
          iVar40 = 4 - (uint)(local_8928._8_4_ == 0);
          iVar60 = local_8938._0_4_;
        }
        uVar74 = uStack_892c;
        local_8908 = (stbi__jpeg *)CONCAT44(local_8908._4_4_,local_8928._0_4_);
        z = local_8928._4_4_;
        uVar43 = local_8928._12_4_;
        s->img_n = iVar40;
        if (2 < req_comp) {
          iVar40 = req_comp;
        }
        sVar67 = s->img_x;
        iVar68 = stbi__mad3sizes_valid(iVar40,sVar67,sVar41,0);
        if (iVar68 == 0) {
          pcVar45 = "too large";
        }
        else {
          data_00 = (uchar *)stbi__malloc_mad3(iVar40,sVar67,sVar41,0);
          if (data_00 != (uchar *)0x0) {
            if (iVar60 < 0x10) {
              iVar68 = (int)local_8988;
              if (0x100 < iVar68 || iVar68 == 0) {
                free(data_00);
                pcVar45 = "invalid";
                goto LAB_00142b81;
              }
              if (0 < iVar68) {
                psVar59 = s->buffer_start;
                psVar62 = s->buffer_start + 1;
                psVar54 = s->img_buffer;
                psVar51 = s->img_buffer_end;
                uVar65 = 0;
                do {
                  if (psVar54 < psVar51) {
                    s->img_buffer = psVar54 + 1;
                    sVar38 = *psVar54;
                    psVar54 = psVar54 + 1;
                  }
                  else if (s->read_from_callbacks == 0) {
                    sVar38 = '\0';
                  }
                  else {
                    iVar66 = (*(s->io).read)(s->io_user_data,(char *)psVar59,s->buflen);
                    if (iVar66 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      sVar38 = '\0';
                      psVar51 = psVar62;
                    }
                    else {
                      sVar38 = *psVar59;
                      psVar51 = psVar59 + iVar66;
                    }
                    s->img_buffer_end = psVar51;
                    s->img_buffer = psVar62;
                    psVar54 = psVar62;
                  }
                  local_88a8.pal[uVar65 - 0xd][2] = sVar38;
                  if (psVar54 < psVar51) {
                    s->img_buffer = psVar54 + 1;
                    sVar38 = *psVar54;
                    psVar54 = psVar54 + 1;
                  }
                  else if (s->read_from_callbacks == 0) {
                    sVar38 = '\0';
                  }
                  else {
                    iVar66 = (*(s->io).read)(s->io_user_data,(char *)psVar59,s->buflen);
                    if (iVar66 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      sVar38 = '\0';
                      psVar51 = psVar62;
                    }
                    else {
                      sVar38 = *psVar59;
                      psVar51 = psVar59 + iVar66;
                    }
                    s->img_buffer_end = psVar51;
                    s->img_buffer = psVar62;
                    psVar54 = psVar62;
                  }
                  local_88a8.pal[uVar65 - 0xd][1] = sVar38;
                  if (psVar54 < psVar51) {
                    s->img_buffer = psVar54 + 1;
                    sVar38 = *psVar54;
                    psVar54 = psVar54 + 1;
                  }
                  else if (s->read_from_callbacks == 0) {
                    sVar38 = '\0';
                  }
                  else {
                    iVar66 = (*(s->io).read)(s->io_user_data,(char *)psVar59,s->buflen);
                    if (iVar66 == 0) {
                      s->read_from_callbacks = 0;
                      s->buffer_start[0] = '\0';
                      sVar38 = '\0';
                      psVar51 = psVar62;
                    }
                    else {
                      sVar38 = *psVar59;
                      psVar51 = psVar59 + iVar66;
                    }
                    s->img_buffer_end = psVar51;
                    s->img_buffer = psVar62;
                    psVar54 = psVar62;
                  }
                  local_88a8.pal[uVar65 - 0xd][0] = sVar38;
                  if (uVar37 != 0xc) {
                    if (psVar54 < psVar51) {
                      psVar54 = psVar54 + 1;
                    }
                    else {
                      if (s->read_from_callbacks == 0) goto LAB_00144a45;
                      iVar66 = (*(s->io).read)(s->io_user_data,(char *)psVar59,s->buflen);
                      if (iVar66 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        psVar51 = psVar62;
                      }
                      else {
                        psVar51 = psVar59 + iVar66;
                      }
                      s->img_buffer_end = psVar51;
                      psVar54 = psVar62;
                    }
                    s->img_buffer = psVar54;
                  }
LAB_00144a45:
                  local_88a8.pal[uVar65 - 0xd][3] = 0xff;
                  uVar65 = uVar65 + 1;
                } while (local_8988 != uVar65);
              }
              stbi__skip(s,(iVar68 * (uVar37 == 0xc | 0xfffffffc) + local_8938._4_4_) -
                           (uVar37 + local_8918));
              if (iVar60 == 1) {
                sVar41 = s->img_y;
                if (0 < (int)sVar41) {
                  local_8978 = -(s->img_x + 7 >> 3) & 3;
                  psVar59 = s->buffer_start;
                  psVar62 = s->buffer_start + 1;
                  iVar68 = 0;
                  iVar60 = 0;
                  do {
                    psVar54 = s->img_buffer;
                    psVar51 = s->img_buffer_end;
                    if (psVar54 < psVar51) {
                      s->img_buffer = psVar54 + 1;
                      bVar39 = *psVar54;
                      psVar54 = psVar54 + 1;
                    }
                    else if (s->read_from_callbacks == 0) {
                      bVar39 = 0;
                    }
                    else {
                      iVar66 = (*(s->io).read)(s->io_user_data,(char *)psVar59,s->buflen);
                      if (iVar66 == 0) {
                        s->read_from_callbacks = 0;
                        s->buffer_start[0] = '\0';
                        bVar39 = 0;
                        psVar51 = psVar62;
                      }
                      else {
                        bVar39 = *psVar59;
                        psVar51 = psVar59 + iVar66;
                      }
                      s->img_buffer_end = psVar51;
                      s->img_buffer = psVar62;
                      psVar54 = psVar62;
                    }
                    sVar41 = s->img_x;
                    if (0 < (int)sVar41) {
                      uVar74 = (uint)bVar39;
                      sVar67 = 0;
                      uVar64 = 7;
                      do {
                        uVar65 = (ulong)((uVar74 >> (uVar64 & 0x1f) & 1) != 0);
                        data_00[iVar68] = local_88a8.pal[uVar65 - 0xd][0];
                        data_00[(long)iVar68 + 1] = local_88a8.pal[uVar65 - 0xd][1];
                        data_00[(long)iVar68 + 2] = local_88a8.pal[uVar65 - 0xd][2];
                        iVar66 = iVar68 + 3;
                        if (iVar40 == 4) {
                          data_00[(long)iVar68 + 3] = 0xff;
                          iVar66 = iVar68 + 4;
                        }
                        iVar68 = iVar66;
                        sVar67 = sVar67 + 1;
                        if (sVar67 == sVar41) break;
                        if ((int)uVar64 < 1) {
                          if (psVar54 < psVar51) {
                            s->img_buffer = psVar54 + 1;
                            uVar74 = (uint)*psVar54;
                            psVar54 = psVar54 + 1;
                          }
                          else if (s->read_from_callbacks == 0) {
                            uVar74 = 0;
                          }
                          else {
                            iVar66 = (*(s->io).read)(s->io_user_data,(char *)psVar59,s->buflen);
                            if (iVar66 == 0) {
                              s->read_from_callbacks = 0;
                              s->buffer_start[0] = '\0';
                              uVar74 = 0;
                              psVar51 = psVar62;
                            }
                            else {
                              uVar74 = (uint)*psVar59;
                              psVar51 = psVar59 + iVar66;
                            }
                            s->img_buffer_end = psVar51;
                            s->img_buffer = psVar62;
                            sVar41 = s->img_x;
                            psVar54 = psVar62;
                          }
                          uVar64 = 7;
                        }
                        else {
                          uVar64 = uVar64 - 1;
                        }
                      } while ((int)sVar67 < (int)sVar41);
                    }
                    stbi__skip(s,local_8978);
                    iVar60 = iVar60 + 1;
                    sVar41 = s->img_y;
                  } while (iVar60 < (int)sVar41);
                }
              }
              else {
                if (iVar60 == 8) {
                  uVar74 = s->img_x;
                }
                else {
                  if (iVar60 != 4) {
                    free(data_00);
                    pcVar45 = "bad bpp";
                    goto LAB_00142b81;
                  }
                  uVar74 = s->img_x + 1 >> 1;
                }
                sVar41 = s->img_y;
                if (0 < (int)sVar41) {
                  local_89b0 = -uVar74 & 3;
                  local_8908 = (stbi__jpeg *)s->buffer_start;
                  psVar59 = s->buffer_start + 1;
                  uVar65 = 0;
                  iVar68 = 0;
                  do {
                    psVar44 = local_8908;
                    if (0 < (int)s->img_x) {
                      psVar62 = s->img_buffer;
                      psVar54 = s->img_buffer_end;
                      iVar66 = 0;
                      do {
                        if (psVar62 < psVar54) {
                          s->img_buffer = psVar62 + 1;
                          bVar39 = *psVar62;
                          psVar62 = psVar62 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar39 = 0;
                        }
                        else {
                          iVar53 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
                          if (iVar53 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar39 = 0;
                            psVar54 = psVar59;
                          }
                          else {
                            bVar39 = *(byte *)psVar44;
                            psVar54 = (stbi_uc *)((long)psVar44 + (long)iVar53);
                          }
                          s->img_buffer_end = psVar54;
                          s->img_buffer = psVar59;
                          psVar62 = psVar59;
                        }
                        uVar74 = (uint)(bVar39 >> 4);
                        if (iVar60 != 4) {
                          uVar74 = (uint)bVar39;
                        }
                        uVar47 = (ulong)uVar74;
                        uVar74 = bVar39 & 0xf;
                        if (iVar60 != 4) {
                          uVar74 = 0;
                        }
                        lVar56 = (long)(int)uVar65;
                        uVar61 = lVar56 + 3;
                        data_00[lVar56] = local_88a8.pal[uVar47 - 0xd][0];
                        data_00[lVar56 + 1] = local_88a8.pal[uVar47 - 0xd][1];
                        data_00[lVar56 + 2] = local_88a8.pal[uVar47 - 0xd][2];
                        if (iVar40 == 4) {
                          data_00[lVar56 + 3] = 0xff;
                          uVar61 = (ulong)((int)uVar65 + 4);
                        }
                        if (iVar66 + 1U == s->img_x) {
                          uVar65 = uVar61 & 0xffffffff;
                          break;
                        }
                        if (iVar60 == 8) {
                          if (psVar62 < psVar54) {
                            s->img_buffer = psVar62 + 1;
                            bVar39 = *psVar62;
                            psVar62 = psVar62 + 1;
                          }
                          else if (s->read_from_callbacks == 0) {
                            bVar39 = 0;
                          }
                          else {
                            iVar53 = (*(s->io).read)(s->io_user_data,(char *)psVar44,s->buflen);
                            if (iVar53 == 0) {
                              s->read_from_callbacks = 0;
                              s->buffer_start[0] = '\0';
                              bVar39 = 0;
                              psVar54 = psVar59;
                            }
                            else {
                              bVar39 = *(byte *)psVar44;
                              psVar54 = (stbi_uc *)((long)psVar44 + (long)iVar53);
                            }
                            s->img_buffer_end = psVar54;
                            s->img_buffer = psVar59;
                            psVar62 = psVar59;
                          }
                          uVar74 = (uint)bVar39;
                        }
                        lVar56 = (long)(int)uVar61;
                        uVar65 = lVar56 + 3;
                        uVar47 = (ulong)uVar74;
                        data_00[lVar56] = local_88a8.pal[uVar47 - 0xd][0];
                        data_00[lVar56 + 1] = local_88a8.pal[uVar47 - 0xd][1];
                        data_00[lVar56 + 2] = local_88a8.pal[uVar47 - 0xd][2];
                        if (iVar40 == 4) {
                          data_00[lVar56 + 3] = 0xff;
                          uVar65 = (ulong)((int)uVar61 + 4);
                        }
                        iVar66 = iVar66 + 2;
                      } while (iVar66 < (int)s->img_x);
                    }
                    stbi__skip(s,local_89b0);
                    iVar68 = iVar68 + 1;
                    sVar41 = s->img_y;
                  } while (iVar68 < (int)sVar41);
                }
              }
            }
            else {
              stbi__skip(s,local_8938._4_4_ - (uVar37 + local_8918));
              uVar64 = (uint)local_8908;
              if (iVar60 == 0x10) {
                local_8944 = s->img_x * 2 & 2;
LAB_001453fe:
                if (z == 0 || ((uint)local_8908 == 0 || uVar74 == 0)) {
                  free(data_00);
                  pcVar45 = "bad masks";
                  goto LAB_00142b81;
                }
                iVar68 = stbi__high_bit(uVar74);
                iVar68 = iVar68 + -7;
                uVar57 = (uVar74 >> 1 & 0x55555555) + (uVar74 & 0x55555555);
                uVar57 = (uVar57 >> 2 & 0x33333333) + (uVar57 & 0x33333333);
                uVar57 = (uVar57 >> 4) + uVar57 & 0xf0f0f0f;
                uVar57 = (uVar57 >> 8) + uVar57;
                uVar57 = (uVar57 >> 0x10) + uVar57 & 0xff;
                iVar66 = stbi__high_bit(uVar64);
                local_8910 = (stbi_uc *)CONCAT44(local_8910._4_4_,iVar66 + -7);
                uVar64 = (uVar64 >> 1 & 0x55555555) + (uVar64 & 0x55555555);
                uVar64 = (uVar64 >> 2 & 0x33333333) + (uVar64 & 0x33333333);
                uVar64 = (uVar64 >> 4) + uVar64 & 0xf0f0f0f;
                uVar64 = (uVar64 >> 8) + uVar64;
                uVar75 = (uVar64 >> 0x10) + uVar64 & 0xff;
                local_8964 = stbi__high_bit(z);
                local_8964 = local_8964 + -7;
                uVar64 = ((uint)z >> 1 & 0x55555555) + (z & 0x55555555);
                uVar64 = (uVar64 >> 2 & 0x33333333) + (uVar64 & 0x33333333);
                uVar64 = (uVar64 >> 4) + uVar64 & 0xf0f0f0f;
                uVar64 = (uVar64 >> 8) + uVar64;
                uVar69 = (uVar64 >> 0x10) + uVar64 & 0xff;
                local_8940 = stbi__high_bit(z_00);
                local_8940 = local_8940 + -7;
                uVar64 = ((uint)z_00 >> 1 & 0x55555555) + (z_00 & 0x55555555);
                uVar64 = (uVar64 >> 2 & 0x33333333) + (uVar64 & 0x33333333);
                uVar64 = (uVar64 >> 4) + uVar64 & 0xf0f0f0f;
                uVar64 = (uVar64 >> 8) + uVar64;
                uVar64 = (uVar64 >> 0x10) + uVar64 & 0xff;
                local_88fc = 1;
                local_88f0 = (anon_struct_96_18_0d0905d3 *)((ulong)local_88f0._4_4_ << 0x20);
              }
              else {
                if (iVar60 == 0x20) {
                  uVar57 = uVar74 ^ 0xff0000 | (uint)local_8908 ^ 0xff00 | z ^ 0xff;
                  local_8944 = 0;
                  if (!(bool)(uVar57 == 0 & bVar79)) goto LAB_001453fe;
                  local_88f0 = (anon_struct_96_18_0d0905d3 *)
                               CONCAT44(local_88f0._4_4_,
                                        (int)CONCAT71((uint7)(uint3)(uVar57 >> 8),1));
                }
                else {
                  local_8944 = 0;
                  if (iVar60 != 0x18) goto LAB_001453fe;
                  local_8944 = s->img_x & 3;
                  local_88f0 = (anon_struct_96_18_0d0905d3 *)((ulong)local_88f0._4_4_ << 0x20);
                }
                local_88fc = 0;
                iVar68 = 0;
                local_8910 = (stbi_uc *)((ulong)local_8910 & 0xffffffff00000000);
                local_8964 = 0;
                local_8940 = 0;
                uVar57 = 0;
                uVar75 = 0;
                uVar69 = 0;
                uVar64 = 0;
              }
              sVar41 = s->img_y;
              if (0 < (int)sVar41) {
                psVar59 = s->buffer_start;
                psVar62 = s->buffer_start + 1;
                local_88f4 = 8 - uVar57;
                local_88f8 = -(int)local_8910;
                local_88c4 = 8 - uVar75;
                local_88c8 = -local_8964;
                local_88cc = 8 - uVar69;
                local_88d4 = -local_8940;
                local_88d0 = 8 - uVar64;
                iVar53 = 0;
                local_88e8 = (ulong)(uVar57 << 2);
                local_88b0 = (ulong)(uVar75 << 2);
                local_88b8 = (ulong)(uVar69 << 2);
                local_88c0 = (ulong)(uVar64 << 2);
                iVar66 = 0;
                do {
                  local_88d8 = iVar66;
                  if ((char)local_88fc == '\0') {
                    if (0 < (int)s->img_x) {
                      psVar54 = s->img_buffer;
                      psVar51 = s->img_buffer_end;
                      iVar66 = 0;
                      do {
                        if (psVar54 < psVar51) {
                          s->img_buffer = psVar54 + 1;
                          bVar39 = *psVar54;
                          psVar54 = psVar54 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar39 = 0;
                        }
                        else {
                          iVar71 = (*(s->io).read)(s->io_user_data,(char *)psVar59,s->buflen);
                          if (iVar71 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar39 = 0;
                            psVar51 = psVar62;
                          }
                          else {
                            bVar39 = *psVar59;
                            psVar51 = psVar59 + iVar71;
                          }
                          s->img_buffer_end = psVar51;
                          s->img_buffer = psVar62;
                          psVar54 = psVar62;
                        }
                        data_00[(long)iVar53 + 2] = bVar39;
                        if (psVar54 < psVar51) {
                          s->img_buffer = psVar54 + 1;
                          bVar39 = *psVar54;
                          psVar54 = psVar54 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar39 = 0;
                        }
                        else {
                          iVar71 = (*(s->io).read)(s->io_user_data,(char *)psVar59,s->buflen);
                          if (iVar71 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar39 = 0;
                            psVar51 = psVar62;
                          }
                          else {
                            bVar39 = *psVar59;
                            psVar51 = psVar59 + iVar71;
                          }
                          s->img_buffer_end = psVar51;
                          s->img_buffer = psVar62;
                          psVar54 = psVar62;
                        }
                        data_00[(long)iVar53 + 1] = bVar39;
                        if (psVar54 < psVar51) {
                          s->img_buffer = psVar54 + 1;
                          bVar39 = *psVar54;
                          psVar54 = psVar54 + 1;
                        }
                        else if (s->read_from_callbacks == 0) {
                          bVar39 = 0;
                        }
                        else {
                          iVar71 = (*(s->io).read)(s->io_user_data,(char *)psVar59,s->buflen);
                          if (iVar71 == 0) {
                            s->read_from_callbacks = 0;
                            s->buffer_start[0] = '\0';
                            bVar39 = 0;
                            psVar51 = psVar62;
                          }
                          else {
                            bVar39 = *psVar59;
                            psVar51 = psVar59 + iVar71;
                          }
                          s->img_buffer_end = psVar51;
                          s->img_buffer = psVar62;
                          psVar54 = psVar62;
                        }
                        data_00[iVar53] = bVar39;
                        bVar39 = 0xff;
                        if ((char)local_88f0 != '\0') {
                          if (psVar54 < psVar51) {
                            s->img_buffer = psVar54 + 1;
                            bVar39 = *psVar54;
                            psVar54 = psVar54 + 1;
                          }
                          else if (s->read_from_callbacks == 0) {
                            bVar39 = 0;
                          }
                          else {
                            iVar71 = (*(s->io).read)(s->io_user_data,(char *)psVar59,s->buflen);
                            if (iVar71 == 0) {
                              s->read_from_callbacks = 0;
                              s->buffer_start[0] = '\0';
                              bVar39 = 0;
                              psVar51 = psVar62;
                            }
                            else {
                              bVar39 = *psVar59;
                              psVar51 = psVar59 + iVar71;
                            }
                            s->img_buffer_end = psVar51;
                            s->img_buffer = psVar62;
                            psVar54 = psVar62;
                          }
                        }
                        iVar71 = iVar53 + 3;
                        if (iVar40 == 4) {
                          data_00[(long)iVar53 + 3] = bVar39;
                          iVar71 = iVar53 + 4;
                        }
                        iVar53 = iVar71;
                        uVar43 = uVar43 | bVar39;
                        iVar66 = iVar66 + 1;
                      } while (iVar66 < (int)s->img_x);
                    }
                  }
                  else if (0 < (int)s->img_x) {
                    iVar66 = 0;
                    do {
                      uVar64 = stbi__get16le(s);
                      if (iVar60 != 0x10) {
                        iVar71 = stbi__get16le(s);
                        uVar64 = uVar64 | iVar71 << 0x10;
                      }
                      uVar57 = (uVar64 & uVar74) >> ((byte)iVar68 & 0x1f);
                      if (iVar68 < 0) {
                        uVar57 = (uVar64 & uVar74) << (-(byte)iVar68 & 0x1f);
                      }
                      uVar69 = (uVar64 & (uint)local_8908) >> ((byte)local_8910 & 0x1f);
                      if ((int)local_8910 < 0) {
                        uVar69 = (uVar64 & (uint)local_8908) << ((byte)local_88f8 & 0x1f);
                      }
                      iVar71 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                       local_88b0);
                      bVar39 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88b0];
                      uVar75 = (uVar64 & z) >> ((byte)local_8964 & 0x1f);
                      if (local_8964 < 0) {
                        uVar75 = (uVar64 & z) << ((byte)local_88c8 & 0x1f);
                      }
                      iVar42 = *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                       local_88b8);
                      bVar2 = stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88b8];
                      data_00[iVar53] =
                           (uchar)((int)((uVar57 >> ((byte)local_88f4 & 0x1f)) *
                                        *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table
                                                + local_88e8)) >>
                                  (stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88e8]
                                  & 0x1f));
                      data_00[(long)iVar53 + 1] =
                           (uchar)((int)((uVar69 >> ((byte)local_88c4 & 0x1f)) * iVar71) >>
                                  (bVar39 & 0x1f));
                      data_00[(long)iVar53 + 2] =
                           (uchar)((int)((uVar75 >> ((byte)local_88cc & 0x1f)) * iVar42) >>
                                  (bVar2 & 0x1f));
                      if (z_00 == 0) {
                        uVar64 = 0xff;
                      }
                      else {
                        uVar57 = (uVar64 & z_00) >> ((byte)local_8940 & 0x1f);
                        if (local_8940 < 0) {
                          uVar57 = (uVar64 & z_00) << ((byte)local_88d4 & 0x1f);
                        }
                        uVar64 = (int)((uVar57 >> ((byte)local_88d0 & 0x1f)) *
                                      *(int *)(stbi__shiftsigned(unsigned_int,int,int)::mul_table +
                                              local_88c0)) >>
                                 (stbi__shiftsigned(unsigned_int,int,int)::shift_table[local_88c0] &
                                 0x1f);
                      }
                      iVar71 = iVar53 + 3;
                      if (iVar40 == 4) {
                        data_00[(long)iVar53 + 3] = (uchar)uVar64;
                        iVar71 = iVar53 + 4;
                      }
                      iVar53 = iVar71;
                      uVar43 = uVar43 | uVar64;
                      iVar66 = iVar66 + 1;
                    } while (iVar66 < (int)s->img_x);
                  }
                  stbi__skip(s,local_8944);
                  iVar66 = local_88d8 + 1;
                  sVar41 = s->img_y;
                } while (iVar66 < (int)sVar41);
              }
            }
            auVar36 = _DAT_00157a20;
            auVar35 = _DAT_00157a10;
            auVar34 = _DAT_00156610;
            auVar33 = _DAT_00156600;
            auVar32 = _DAT_001565f0;
            auVar31 = _DAT_001565b0;
            auVar118 = _DAT_00153050;
            if (((iVar40 == 4) && (uVar43 == 0)) &&
               (uVar74 = s->img_x * sVar41 * 4 - 1, -1 < (int)uVar74)) {
              uVar43 = uVar74 >> 2;
              auVar80._4_4_ = 0;
              auVar80._0_4_ = uVar43;
              auVar80._8_4_ = uVar43;
              auVar80._12_4_ = 0;
              puVar52 = data_00 + uVar74;
              uVar65 = 0;
              do {
                auVar98._8_4_ = (int)uVar65;
                auVar98._0_8_ = uVar65;
                auVar98._12_4_ = (int)(uVar65 >> 0x20);
                auVar100 = auVar80 | auVar118;
                auVar102 = (auVar98 | auVar31) ^ auVar118;
                iVar60 = auVar100._0_4_;
                iVar71 = -(uint)(iVar60 < auVar102._0_4_);
                iVar68 = auVar100._4_4_;
                auVar104._4_4_ = -(uint)(iVar68 < auVar102._4_4_);
                iVar66 = auVar100._8_4_;
                iVar42 = -(uint)(iVar66 < auVar102._8_4_);
                iVar53 = auVar100._12_4_;
                auVar104._12_4_ = -(uint)(iVar53 < auVar102._12_4_);
                auVar81._4_4_ = iVar71;
                auVar81._0_4_ = iVar71;
                auVar81._8_4_ = iVar42;
                auVar81._12_4_ = iVar42;
                auVar81 = pshuflw(in_XMM1,auVar81,0xe8);
                auVar103._4_4_ = -(uint)(auVar102._4_4_ == iVar68);
                auVar103._12_4_ = -(uint)(auVar102._12_4_ == iVar53);
                auVar103._0_4_ = auVar103._4_4_;
                auVar103._8_4_ = auVar103._12_4_;
                auVar90 = pshuflw(in_XMM2,auVar103,0xe8);
                auVar104._0_4_ = auVar104._4_4_;
                auVar104._8_4_ = auVar104._12_4_;
                auVar102 = pshuflw(auVar81,auVar104,0xe8);
                auVar100._8_4_ = 0xffffffff;
                auVar100._0_8_ = 0xffffffffffffffff;
                auVar100._12_4_ = 0xffffffff;
                auVar100 = (auVar102 | auVar90 & auVar81) ^ auVar100;
                auVar100 = packssdw(auVar100,auVar100);
                if ((auVar100 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  *puVar52 = 0xff;
                }
                auVar90._4_4_ = iVar71;
                auVar90._0_4_ = iVar71;
                auVar90._8_4_ = iVar42;
                auVar90._12_4_ = iVar42;
                auVar104 = auVar103 & auVar90 | auVar104;
                auVar100 = packssdw(auVar104,auVar104);
                auVar102._8_4_ = 0xffffffff;
                auVar102._0_8_ = 0xffffffffffffffff;
                auVar102._12_4_ = 0xffffffff;
                auVar100 = packssdw(auVar100 ^ auVar102,auVar100 ^ auVar102);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100._0_4_ >> 8 & 1) != 0) {
                  puVar52[-4] = 0xff;
                }
                auVar100 = (auVar98 | auVar34) ^ auVar118;
                auVar91._0_4_ = -(uint)(iVar60 < auVar100._0_4_);
                auVar91._4_4_ = -(uint)(iVar68 < auVar100._4_4_);
                auVar91._8_4_ = -(uint)(iVar66 < auVar100._8_4_);
                auVar91._12_4_ = -(uint)(iVar53 < auVar100._12_4_);
                auVar105._4_4_ = auVar91._0_4_;
                auVar105._0_4_ = auVar91._0_4_;
                auVar105._8_4_ = auVar91._8_4_;
                auVar105._12_4_ = auVar91._8_4_;
                iVar71 = -(uint)(auVar100._4_4_ == iVar68);
                iVar42 = -(uint)(auVar100._12_4_ == iVar53);
                auVar17._4_4_ = iVar71;
                auVar17._0_4_ = iVar71;
                auVar17._8_4_ = iVar42;
                auVar17._12_4_ = iVar42;
                auVar115._4_4_ = auVar91._4_4_;
                auVar115._0_4_ = auVar91._4_4_;
                auVar115._8_4_ = auVar91._12_4_;
                auVar115._12_4_ = auVar91._12_4_;
                auVar100 = auVar17 & auVar105 | auVar115;
                auVar100 = packssdw(auVar100,auVar100);
                auVar8._8_4_ = 0xffffffff;
                auVar8._0_8_ = 0xffffffffffffffff;
                auVar8._12_4_ = 0xffffffff;
                auVar100 = packssdw(auVar100 ^ auVar8,auVar100 ^ auVar8);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100._0_4_ >> 0x10 & 1) != 0) {
                  puVar52[-8] = 0xff;
                }
                auVar100 = pshufhw(auVar100,auVar105,0x84);
                auVar18._4_4_ = iVar71;
                auVar18._0_4_ = iVar71;
                auVar18._8_4_ = iVar42;
                auVar18._12_4_ = iVar42;
                auVar102 = pshufhw(auVar91,auVar18,0x84);
                auVar81 = pshufhw(auVar100,auVar115,0x84);
                auVar82._8_4_ = 0xffffffff;
                auVar82._0_8_ = 0xffffffffffffffff;
                auVar82._12_4_ = 0xffffffff;
                auVar82 = (auVar81 | auVar102 & auVar100) ^ auVar82;
                auVar100 = packssdw(auVar82,auVar82);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100._0_4_ >> 0x18 & 1) != 0) {
                  puVar52[-0xc] = 0xff;
                }
                auVar100 = (auVar98 | auVar33) ^ auVar118;
                auVar92._0_4_ = -(uint)(iVar60 < auVar100._0_4_);
                auVar92._4_4_ = -(uint)(iVar68 < auVar100._4_4_);
                auVar92._8_4_ = -(uint)(iVar66 < auVar100._8_4_);
                auVar92._12_4_ = -(uint)(iVar53 < auVar100._12_4_);
                auVar19._4_4_ = auVar92._0_4_;
                auVar19._0_4_ = auVar92._0_4_;
                auVar19._8_4_ = auVar92._8_4_;
                auVar19._12_4_ = auVar92._8_4_;
                auVar102 = pshuflw(auVar115,auVar19,0xe8);
                auVar83._0_4_ = -(uint)(auVar100._0_4_ == iVar60);
                auVar83._4_4_ = -(uint)(auVar100._4_4_ == iVar68);
                auVar83._8_4_ = -(uint)(auVar100._8_4_ == iVar66);
                auVar83._12_4_ = -(uint)(auVar100._12_4_ == iVar53);
                auVar106._4_4_ = auVar83._4_4_;
                auVar106._0_4_ = auVar83._4_4_;
                auVar106._8_4_ = auVar83._12_4_;
                auVar106._12_4_ = auVar83._12_4_;
                auVar100 = pshuflw(auVar83,auVar106,0xe8);
                auVar107._4_4_ = auVar92._4_4_;
                auVar107._0_4_ = auVar92._4_4_;
                auVar107._8_4_ = auVar92._12_4_;
                auVar107._12_4_ = auVar92._12_4_;
                auVar81 = pshuflw(auVar92,auVar107,0xe8);
                auVar9._8_4_ = 0xffffffff;
                auVar9._0_8_ = 0xffffffffffffffff;
                auVar9._12_4_ = 0xffffffff;
                auVar100 = packssdw(auVar100 & auVar102,(auVar81 | auVar100 & auVar102) ^ auVar9);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  puVar52[-0x10] = 0xff;
                }
                auVar20._4_4_ = auVar92._0_4_;
                auVar20._0_4_ = auVar92._0_4_;
                auVar20._8_4_ = auVar92._8_4_;
                auVar20._12_4_ = auVar92._8_4_;
                auVar107 = auVar106 & auVar20 | auVar107;
                auVar81 = packssdw(auVar107,auVar107);
                auVar10._8_4_ = 0xffffffff;
                auVar10._0_8_ = 0xffffffffffffffff;
                auVar10._12_4_ = 0xffffffff;
                auVar100 = packssdw(auVar100,auVar81 ^ auVar10);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100._4_2_ >> 8 & 1) != 0) {
                  puVar52[-0x14] = 0xff;
                }
                auVar100 = (auVar98 | auVar32) ^ auVar118;
                auVar93._0_4_ = -(uint)(iVar60 < auVar100._0_4_);
                auVar93._4_4_ = -(uint)(iVar68 < auVar100._4_4_);
                auVar93._8_4_ = -(uint)(iVar66 < auVar100._8_4_);
                auVar93._12_4_ = -(uint)(iVar53 < auVar100._12_4_);
                auVar108._4_4_ = auVar93._0_4_;
                auVar108._0_4_ = auVar93._0_4_;
                auVar108._8_4_ = auVar93._8_4_;
                auVar108._12_4_ = auVar93._8_4_;
                iVar71 = -(uint)(auVar100._4_4_ == iVar68);
                iVar42 = -(uint)(auVar100._12_4_ == iVar53);
                auVar21._4_4_ = iVar71;
                auVar21._0_4_ = iVar71;
                auVar21._8_4_ = iVar42;
                auVar21._12_4_ = iVar42;
                auVar116._4_4_ = auVar93._4_4_;
                auVar116._0_4_ = auVar93._4_4_;
                auVar116._8_4_ = auVar93._12_4_;
                auVar116._12_4_ = auVar93._12_4_;
                auVar100 = auVar21 & auVar108 | auVar116;
                auVar100 = packssdw(auVar100,auVar100);
                auVar11._8_4_ = 0xffffffff;
                auVar11._0_8_ = 0xffffffffffffffff;
                auVar11._12_4_ = 0xffffffff;
                auVar100 = packssdw(auVar100 ^ auVar11,auVar100 ^ auVar11);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  puVar52[-0x18] = 0xff;
                }
                auVar100 = pshufhw(auVar100,auVar108,0x84);
                auVar22._4_4_ = iVar71;
                auVar22._0_4_ = iVar71;
                auVar22._8_4_ = iVar42;
                auVar22._12_4_ = iVar42;
                auVar102 = pshufhw(auVar93,auVar22,0x84);
                auVar81 = pshufhw(auVar100,auVar116,0x84);
                auVar84._8_4_ = 0xffffffff;
                auVar84._0_8_ = 0xffffffffffffffff;
                auVar84._12_4_ = 0xffffffff;
                auVar84 = (auVar81 | auVar102 & auVar100) ^ auVar84;
                auVar100 = packssdw(auVar84,auVar84);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100._6_2_ >> 8 & 1) != 0) {
                  puVar52[-0x1c] = 0xff;
                }
                auVar100 = (auVar98 | auVar36) ^ auVar118;
                auVar94._0_4_ = -(uint)(iVar60 < auVar100._0_4_);
                auVar94._4_4_ = -(uint)(iVar68 < auVar100._4_4_);
                auVar94._8_4_ = -(uint)(iVar66 < auVar100._8_4_);
                auVar94._12_4_ = -(uint)(iVar53 < auVar100._12_4_);
                auVar23._4_4_ = auVar94._0_4_;
                auVar23._0_4_ = auVar94._0_4_;
                auVar23._8_4_ = auVar94._8_4_;
                auVar23._12_4_ = auVar94._8_4_;
                auVar102 = pshuflw(auVar116,auVar23,0xe8);
                auVar85._0_4_ = -(uint)(auVar100._0_4_ == iVar60);
                auVar85._4_4_ = -(uint)(auVar100._4_4_ == iVar68);
                auVar85._8_4_ = -(uint)(auVar100._8_4_ == iVar66);
                auVar85._12_4_ = -(uint)(auVar100._12_4_ == iVar53);
                auVar109._4_4_ = auVar85._4_4_;
                auVar109._0_4_ = auVar85._4_4_;
                auVar109._8_4_ = auVar85._12_4_;
                auVar109._12_4_ = auVar85._12_4_;
                auVar100 = pshuflw(auVar85,auVar109,0xe8);
                auVar110._4_4_ = auVar94._4_4_;
                auVar110._0_4_ = auVar94._4_4_;
                auVar110._8_4_ = auVar94._12_4_;
                auVar110._12_4_ = auVar94._12_4_;
                auVar81 = pshuflw(auVar94,auVar110,0xe8);
                auVar95._8_4_ = 0xffffffff;
                auVar95._0_8_ = 0xffffffffffffffff;
                auVar95._12_4_ = 0xffffffff;
                auVar95 = (auVar81 | auVar100 & auVar102) ^ auVar95;
                auVar81 = packssdw(auVar95,auVar95);
                auVar100 = packsswb(auVar100 & auVar102,auVar81);
                if ((auVar100 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                  puVar52[-0x20] = 0xff;
                }
                auVar24._4_4_ = auVar94._0_4_;
                auVar24._0_4_ = auVar94._0_4_;
                auVar24._8_4_ = auVar94._8_4_;
                auVar24._12_4_ = auVar94._8_4_;
                auVar110 = auVar109 & auVar24 | auVar110;
                auVar81 = packssdw(auVar110,auVar110);
                auVar12._8_4_ = 0xffffffff;
                auVar12._0_8_ = 0xffffffffffffffff;
                auVar12._12_4_ = 0xffffffff;
                auVar81 = packssdw(auVar81 ^ auVar12,auVar81 ^ auVar12);
                auVar100 = packsswb(auVar100,auVar81);
                if ((auVar100._8_2_ >> 8 & 1) != 0) {
                  puVar52[-0x24] = 0xff;
                }
                auVar100 = (auVar98 | auVar35) ^ auVar118;
                auVar96._0_4_ = -(uint)(iVar60 < auVar100._0_4_);
                auVar96._4_4_ = -(uint)(iVar68 < auVar100._4_4_);
                auVar96._8_4_ = -(uint)(iVar66 < auVar100._8_4_);
                auVar96._12_4_ = -(uint)(iVar53 < auVar100._12_4_);
                auVar111._4_4_ = auVar96._0_4_;
                auVar111._0_4_ = auVar96._0_4_;
                auVar111._8_4_ = auVar96._8_4_;
                auVar111._12_4_ = auVar96._8_4_;
                iVar71 = -(uint)(auVar100._4_4_ == iVar68);
                iVar42 = -(uint)(auVar100._12_4_ == iVar53);
                auVar25._4_4_ = iVar71;
                auVar25._0_4_ = iVar71;
                auVar25._8_4_ = iVar42;
                auVar25._12_4_ = iVar42;
                auVar117._4_4_ = auVar96._4_4_;
                auVar117._0_4_ = auVar96._4_4_;
                auVar117._8_4_ = auVar96._12_4_;
                auVar117._12_4_ = auVar96._12_4_;
                auVar100 = auVar25 & auVar111 | auVar117;
                auVar100 = packssdw(auVar100,auVar100);
                auVar13._8_4_ = 0xffffffff;
                auVar13._0_8_ = 0xffffffffffffffff;
                auVar13._12_4_ = 0xffffffff;
                auVar100 = packssdw(auVar100 ^ auVar13,auVar100 ^ auVar13);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                  puVar52[-0x28] = 0xff;
                }
                auVar100 = pshufhw(auVar100,auVar111,0x84);
                auVar26._4_4_ = iVar71;
                auVar26._0_4_ = iVar71;
                auVar26._8_4_ = iVar42;
                auVar26._12_4_ = iVar42;
                auVar102 = pshufhw(auVar96,auVar26,0x84);
                auVar81 = pshufhw(auVar100,auVar117,0x84);
                auVar86._8_4_ = 0xffffffff;
                auVar86._0_8_ = 0xffffffffffffffff;
                auVar86._12_4_ = 0xffffffff;
                auVar86 = (auVar81 | auVar102 & auVar100) ^ auVar86;
                auVar100 = packssdw(auVar86,auVar86);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100._10_2_ >> 8 & 1) != 0) {
                  puVar52[-0x2c] = 0xff;
                }
                auVar100 = (auVar98 | _DAT_00157a00) ^ auVar118;
                auVar97._0_4_ = -(uint)(iVar60 < auVar100._0_4_);
                auVar97._4_4_ = -(uint)(iVar68 < auVar100._4_4_);
                auVar97._8_4_ = -(uint)(iVar66 < auVar100._8_4_);
                auVar97._12_4_ = -(uint)(iVar53 < auVar100._12_4_);
                auVar27._4_4_ = auVar97._0_4_;
                auVar27._0_4_ = auVar97._0_4_;
                auVar27._8_4_ = auVar97._8_4_;
                auVar27._12_4_ = auVar97._8_4_;
                auVar102 = pshuflw(auVar117,auVar27,0xe8);
                auVar87._0_4_ = -(uint)(auVar100._0_4_ == iVar60);
                auVar87._4_4_ = -(uint)(auVar100._4_4_ == iVar68);
                auVar87._8_4_ = -(uint)(auVar100._8_4_ == iVar66);
                auVar87._12_4_ = -(uint)(auVar100._12_4_ == iVar53);
                auVar112._4_4_ = auVar87._4_4_;
                auVar112._0_4_ = auVar87._4_4_;
                auVar112._8_4_ = auVar87._12_4_;
                auVar112._12_4_ = auVar87._12_4_;
                auVar100 = pshuflw(auVar87,auVar112,0xe8);
                auVar113._4_4_ = auVar97._4_4_;
                auVar113._0_4_ = auVar97._4_4_;
                auVar113._8_4_ = auVar97._12_4_;
                auVar113._12_4_ = auVar97._12_4_;
                auVar81 = pshuflw(auVar97,auVar113,0xe8);
                auVar14._8_4_ = 0xffffffff;
                auVar14._0_8_ = 0xffffffffffffffff;
                auVar14._12_4_ = 0xffffffff;
                auVar100 = packssdw(auVar100 & auVar102,(auVar81 | auVar100 & auVar102) ^ auVar14);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                  puVar52[-0x30] = 0xff;
                }
                auVar28._4_4_ = auVar97._0_4_;
                auVar28._0_4_ = auVar97._0_4_;
                auVar28._8_4_ = auVar97._8_4_;
                auVar28._12_4_ = auVar97._8_4_;
                auVar113 = auVar112 & auVar28 | auVar113;
                auVar81 = packssdw(auVar113,auVar113);
                auVar15._8_4_ = 0xffffffff;
                auVar15._0_8_ = 0xffffffffffffffff;
                auVar15._12_4_ = 0xffffffff;
                auVar100 = packssdw(auVar100,auVar81 ^ auVar15);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100._12_2_ >> 8 & 1) != 0) {
                  puVar52[-0x34] = 0xff;
                }
                auVar100 = (auVar98 | _DAT_001579f0) ^ auVar118;
                auVar88._0_4_ = -(uint)(iVar60 < auVar100._0_4_);
                auVar88._4_4_ = -(uint)(iVar68 < auVar100._4_4_);
                auVar88._8_4_ = -(uint)(iVar66 < auVar100._8_4_);
                auVar88._12_4_ = -(uint)(iVar53 < auVar100._12_4_);
                auVar114._4_4_ = auVar88._0_4_;
                auVar114._0_4_ = auVar88._0_4_;
                auVar114._8_4_ = auVar88._8_4_;
                auVar114._12_4_ = auVar88._8_4_;
                auVar99._4_4_ = -(uint)(auVar100._4_4_ == iVar68);
                auVar99._12_4_ = -(uint)(auVar100._12_4_ == iVar53);
                auVar99._0_4_ = auVar99._4_4_;
                auVar99._8_4_ = auVar99._12_4_;
                auVar101._4_4_ = auVar88._4_4_;
                auVar101._0_4_ = auVar88._4_4_;
                auVar101._8_4_ = auVar88._12_4_;
                auVar101._12_4_ = auVar88._12_4_;
                auVar81 = auVar99 & auVar114 | auVar101;
                auVar100 = packssdw(auVar88,auVar81);
                auVar16._8_4_ = 0xffffffff;
                auVar16._0_8_ = 0xffffffffffffffff;
                auVar16._12_4_ = 0xffffffff;
                auVar100 = packssdw(auVar100 ^ auVar16,auVar100 ^ auVar16);
                auVar100 = packsswb(auVar100,auVar100);
                if ((auVar100 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                  puVar52[-0x38] = 0xff;
                }
                auVar100 = pshufhw(auVar100,auVar114,0x84);
                in_XMM2 = pshufhw(auVar81,auVar99,0x84);
                in_XMM2 = in_XMM2 & auVar100;
                auVar100 = pshufhw(auVar100,auVar101,0x84);
                auVar89._8_4_ = 0xffffffff;
                auVar89._0_8_ = 0xffffffffffffffff;
                auVar89._12_4_ = 0xffffffff;
                auVar89 = (auVar100 | in_XMM2) ^ auVar89;
                auVar100 = packssdw(auVar89,auVar89);
                in_XMM1 = packsswb(auVar100,auVar100);
                if ((in_XMM1._14_2_ >> 8 & 1) != 0) {
                  puVar52[-0x3c] = 0xff;
                }
                uVar65 = uVar65 + 0x10;
                puVar52 = puVar52 + -0x40;
              } while ((uVar43 + 0x10 & 0x3ffffff0) != uVar65);
            }
            if ((int)local_88dc < 1) {
              uVar74 = s->img_x;
            }
            else {
              uVar74 = s->img_x;
              if (0 < (int)sVar41 >> 1) {
                uVar43 = uVar74 * iVar40;
                uVar64 = (sVar41 - 1) * uVar43;
                uVar65 = 0;
                uVar47 = 0;
                do {
                  if (0 < (int)uVar43) {
                    uVar61 = 0;
                    do {
                      uVar3 = data_00[uVar61 + uVar65];
                      data_00[uVar61 + uVar65] = data_00[uVar61 + uVar64];
                      data_00[uVar61 + uVar64] = uVar3;
                      uVar61 = uVar61 + 1;
                    } while (uVar43 != uVar61);
                  }
                  uVar47 = uVar47 + 1;
                  uVar64 = uVar64 - uVar43;
                  uVar65 = (ulong)((int)uVar65 + uVar43);
                } while (uVar47 != (uint)((int)sVar41 >> 1));
              }
            }
            if ((req_comp == 0) || (iVar40 == req_comp)) {
LAB_0014657d:
              *x = uVar74;
              *y = s->img_y;
              if (comp == (int *)0x0) {
                return data_00;
              }
              *comp = s->img_n;
              return data_00;
            }
            data_00 = stbi__convert_format(data_00,iVar40,req_comp,uVar74,sVar41);
            if (data_00 != (uchar *)0x0) {
              uVar74 = s->img_x;
              goto LAB_0014657d;
            }
            goto LAB_00142b8a;
          }
          pcVar45 = "outofmem";
        }
      }
      else {
        if (s->read_from_callbacks != 0) {
          psVar54 = s->buffer_start;
          iVar40 = (*(s->io).read)(s->io_user_data,(char *)psVar54,s->buflen);
          if (iVar40 == 0) {
            s->read_from_callbacks = 0;
            psVar62 = s->buffer_start + 1;
            s->buffer_start[0] = '\0';
            sVar38 = '\0';
          }
          else {
            psVar62 = psVar54 + iVar40;
            sVar38 = *psVar54;
          }
          s->img_buffer_end = psVar62;
          psVar51 = s->buffer_start + 1;
          s->img_buffer = psVar51;
          goto LAB_00144137;
        }
LAB_0014431b:
        s->img_buffer = s->img_buffer_original;
        s->img_buffer_end = s->img_buffer_original_end;
LAB_0014432d:
        iVar40 = stbi__gif_test(s);
        if (iVar40 != 0) {
          memset(&local_88a8,0,0x8870);
          psVar50 = (stbi__context *)stbi__gif_load_next(s,&local_88a8,comp,0,psVar59);
          if (psVar50 == (stbi__context *)0x0 || psVar50 == s) {
            if (local_88a8.out != (stbi_uc *)0x0) {
              free(local_88a8.out);
            }
            psVar50 = (stbi__context *)0x0;
          }
          else {
            *x = local_88a8.w;
            *y = local_88a8.h;
            if ((req_comp & 0xfffffffbU) != 0) {
              psVar50 = (stbi__context *)
                        stbi__convert_format((uchar *)psVar50,4,req_comp,local_88a8.w,local_88a8.h);
            }
          }
          free(local_88a8.history);
          psVar44 = (stbi__jpeg *)local_88a8.background;
          goto LAB_0014486d;
        }
        iVar40 = stbi__psd_test(s);
        if (iVar40 != 0) {
          pvVar48 = stbi__psd_load(s,x,y,comp,req_comp,ri,bpc);
          return pvVar48;
        }
        iVar40 = stbi__pic_test(s);
        if (iVar40 != 0) {
          pvVar48 = stbi__pic_load(s,x,y,comp,req_comp,ri_00);
          return pvVar48;
        }
        iVar40 = stbi__pnm_test(s);
        if (iVar40 != 0) {
          pvVar48 = stbi__pnm_load(s,x,y,comp,req_comp,ri_00);
          return pvVar48;
        }
        iVar40 = stbi__hdr_test(s);
        if (iVar40 != 0) {
          data_01 = stbi__hdr_load(s,x,y,comp,req_comp,ri_00);
          if (req_comp == 0) {
            req_comp = *comp;
          }
          psVar59 = stbi__hdr_to_ldr(data_01,*x,*y,req_comp);
          return psVar59;
        }
        iVar40 = stbi__tga_test(s);
        if (iVar40 != 0) {
          pvVar48 = stbi__tga_load(s,x,y,comp,req_comp,ri_00);
          return pvVar48;
        }
        pcVar45 = "unknown image type";
      }
LAB_00142b81:
      *(char **)(in_FS_OFFSET + -0x10) = pcVar45;
    }
    else {
      if (4 < (uint)req_comp) {
        pcVar45 = "bad req_comp";
        goto LAB_00142b81;
      }
      local_88a8._0_8_ = s;
      iVar40 = stbi__parse_png_file((stbi__png *)&local_88a8,0,req_comp);
      uVar7 = local_88a8._0_8_;
      if (iVar40 == 0) {
        psVar73 = (stbi__uint16 *)0x0;
        __ptr = (stbi__uint16 *)local_88a8.history;
        goto LAB_001441bf;
      }
      iVar40 = 8;
      if (8 < local_88a8.flags) {
        iVar40 = local_88a8.flags;
      }
      ri->bits_per_channel = iVar40;
      if ((req_comp == 0) || (iVar40 = *(int *)(local_88a8._0_8_ + 0xc), iVar40 == req_comp)) {
LAB_0014419d:
        *x = *(stbi__uint32 *)uVar7;
        *y = *(stbi__uint32 *)(uVar7 + 4);
        if (comp != (int *)0x0) {
          *comp = *(int *)(uVar7 + 8);
        }
        __ptr = (stbi__uint16 *)0x0;
        psVar73 = (stbi__uint16 *)local_88a8.history;
LAB_001441bf:
        free(__ptr);
        free(local_88a8.background);
        free(local_88a8.out);
        return psVar73;
      }
      if (local_88a8.flags < 9) {
        local_88a8.history =
             stbi__convert_format
                       (local_88a8.history,iVar40,req_comp,*(stbi__uint32 *)local_88a8._0_8_,
                        *(stbi__uint32 *)(local_88a8._0_8_ + 4));
      }
      else {
        local_88a8.history =
             (stbi_uc *)
             stbi__convert_format16
                       ((stbi__uint16 *)local_88a8.history,iVar40,req_comp,
                        *(stbi__uint32 *)local_88a8._0_8_,*(stbi__uint32 *)(local_88a8._0_8_ + 4));
      }
      *(int *)(uVar7 + 0xc) = req_comp;
      if ((stbi__uint16 *)local_88a8.history != (stbi__uint16 *)0x0) goto LAB_0014419d;
    }
LAB_00142b8a:
    psVar50 = (stbi__context *)0x0;
  }
  return psVar50;
LAB_00143f0b:
  bVar79 = false;
LAB_00143f0d:
  if (!bVar79) goto LAB_00144859;
LAB_00143f15:
  bVar39 = psVar44->marker;
LAB_00143f1d:
  if (bVar39 == 0xff) {
LAB_00143f25:
    do {
      psVar50 = psVar44->s;
      if ((psVar50->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_00143f45:
        if (psVar50->img_buffer_end <= psVar50->img_buffer) goto LAB_00142c84;
      }
      else {
        iVar40 = (*(psVar50->io).eof)(psVar50->io_user_data);
        if (iVar40 != 0) {
          if (psVar50->read_from_callbacks != 0) goto LAB_00143f45;
          goto LAB_00142c84;
        }
      }
      psVar50 = psVar44->s;
      psVar59 = psVar50->img_buffer;
      if (psVar59 < psVar50->img_buffer_end) {
        psVar50->img_buffer = psVar59 + 1;
        sVar38 = *psVar59;
      }
      else {
        if (psVar50->read_from_callbacks == 0) goto LAB_00143f25;
        psVar59 = psVar50->buffer_start;
        iVar40 = (*(psVar50->io).read)(psVar50->io_user_data,(char *)psVar59,psVar50->buflen);
        if (iVar40 == 0) {
          psVar50->read_from_callbacks = 0;
          psVar62 = psVar50->buffer_start + 1;
          psVar50->buffer_start[0] = '\0';
          sVar38 = '\0';
        }
        else {
          psVar62 = psVar59 + iVar40;
          sVar38 = *psVar59;
        }
        psVar50->img_buffer_end = psVar62;
        psVar50->img_buffer = psVar50->buffer_start + 1;
      }
    } while (sVar38 != 0xff);
    psVar50 = psVar44->s;
    psVar59 = psVar50->img_buffer;
    if (psVar59 < psVar50->img_buffer_end) {
      psVar50->img_buffer = psVar59 + 1;
      sVar38 = *psVar59;
    }
    else if (psVar50->read_from_callbacks == 0) {
      sVar38 = '\0';
    }
    else {
      psVar59 = psVar50->buffer_start;
      iVar40 = (*(psVar50->io).read)(psVar50->io_user_data,(char *)psVar59,psVar50->buflen);
      if (iVar40 == 0) {
        psVar50->read_from_callbacks = 0;
        psVar62 = psVar50->buffer_start + 1;
        psVar50->buffer_start[0] = '\0';
        sVar38 = '\0';
      }
      else {
        psVar62 = psVar59 + iVar40;
        sVar38 = *psVar59;
      }
      psVar50->img_buffer_end = psVar62;
      psVar50->img_buffer = psVar50->buffer_start + 1;
    }
    psVar44->marker = sVar38;
  }
LAB_00142c84:
  bVar39 = stbi__get_marker(psVar44);
  goto LAB_00142c2e;
LAB_001465b9:
  paVar58 = (anon_struct_96_18_0d0905d3 *)(ulong)(uVar43 - 0x10);
  psVar44->code_bits = uVar43 - 0x10;
LAB_001465c4:
  pcVar45 = "bad huffman code";
LAB_00144850:
  uVar74 = (uint)paVar58;
  *(char **)(in_FS_OFFSET + -0x10) = pcVar45;
  goto LAB_00144859;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int bpc)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #else
   STBI_NOTUSED(bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}